

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  uint *puVar1;
  unsigned_short *puVar2;
  byte bVar3;
  ushort uVar4;
  size_t sVar5;
  ulong *puVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  char cVar11;
  lzham_decompress_status_t lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ushort *puVar18;
  uint64 uVar19;
  uint uVar20;
  ulong uVar21;
  undefined4 uVar22;
  ulong uVar23;
  decoder_tables *pdVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  undefined4 uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  int iVar33;
  void *pvVar34;
  ulong uVar35;
  ulong uVar36;
  byte bVar37;
  undefined4 uVar38;
  lzham_decompressor *pState;
  undefined4 uVar39;
  int iVar40;
  undefined4 uVar41;
  uint uVar42;
  undefined4 uVar43;
  byte *pbVar44;
  byte *pbVar45;
  size_t sVar46;
  raw_quasi_adaptive_huffman_data_model *prVar47;
  uint uVar48;
  ulong uVar49;
  uint uStack_a8;
  uint uStack_a4;
  int iStack_a0;
  uint uStack_9c;
  uint *puStack_98;
  uint uStack_8c;
  int iStack_84;
  undefined8 uStack_80;
  raw_quasi_adaptive_huffman_data_model *prStack_78;
  uint uStack_70;
  int iStack_6c;
  raw_quasi_adaptive_huffman_data_model *prStack_68;
  undefined8 uStack_60;
  ulong uStack_58;
  
  if (((((p == (lzham_decompress_state_ptr)0x0) || (pOut_buf_size == (size_t *)0x0)) ||
       (pIn_buf_size == (size_t *)0x0)) || (*(int *)((long)p + 0x58c) == 0)) ||
     (((pIn_buf == (lzham_uint8 *)0x0 && (*pIn_buf_size != 0)) ||
      (sVar5 = *pOut_buf_size, pOut_buf == (lzham_uint8 *)0x0 && sVar5 != 0)))) {
    return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  *(lzham_uint8 **)((long)p + 0x550) = pIn_buf;
  *(size_t **)((long)p + 0x558) = pIn_buf_size;
  *(lzham_uint8 **)((long)p + 0x560) = pOut_buf;
  *(size_t **)((long)p + 0x568) = pOut_buf_size;
  *(bool *)((long)p + 0x570) = no_more_input_bytes_flag != 0;
  if (*(int *)((long)p + 0x590) != 0) {
    if (*(lzham_uint8 **)((long)p + 0x578) == (lzham_uint8 *)0x0) {
      *(lzham_uint8 **)((long)p + 0x578) = pOut_buf;
      *(size_t *)((long)p + 0x580) = sVar5;
    }
    else {
      if (*(lzham_uint8 **)((long)p + 0x578) != pOut_buf) {
        return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }
      if (*(size_t *)((long)p + 0x580) != sVar5) {
        return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }
    }
    if (*(int *)((long)p + 0x590) == 0) {
      lVar12 = lzham_decompressor::decompress<false>((lzham_decompressor *)p);
      return lVar12;
    }
    puVar6 = *(ulong **)((long)p + 0x568);
    uVar36 = *puVar6;
    pbVar7 = *(byte **)((long)p + 0x560);
    iVar40 = *p;
    if (iVar40 < 0x22b) {
      if (iVar40 < 0x17c) {
        if (iVar40 < 0x137) {
          if (iVar40 < 0x11a) {
            if (iVar40 == 0) {
              uVar49 = 0;
              bVar10 = symbol_codec::start_decoding
                                 ((symbol_codec *)((long)p + 0x490),*(uint8 **)((long)p + 0x550),
                                  **(size_t **)((long)p + 0x558),*(bool *)((long)p + 0x570),
                                  (need_bytes_func_ptr)0x0,(void *)0x0);
              if (bVar10) {
                uVar32 = *(uint *)((long)p + 0x510);
                uStack_80._0_4_ = *(uint *)((long)p + 0x514);
                puStack_98 = *(uint **)((long)p + 0x498);
                uVar21 = *(ulong *)((long)p + 0x4c8);
                iVar40 = *(int *)((long)p + 0x4d0);
                uStack_9c = 0;
                uStack_70 = 0;
                uStack_8c = 0;
                iStack_a0 = 0;
                uStack_80._4_4_ = 0;
                iStack_6c = 0;
                uStack_60._4_4_ = 0;
                goto LAB_00114521;
              }
              return LZHAM_DECOMP_STATUS_FAILED;
            }
            if (iVar40 == 0xff) {
              lVar25 = *(long *)((long)p + 0x550);
              lVar26 = **(long **)((long)p + 0x558);
              *(long *)((long)p + 0x490) = lVar25;
              *(long *)((long)p + 0x498) = lVar25;
              *(long *)((long)p + 0x4a8) = lVar26;
              *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
              *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
              if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
                uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
                iStack_6c = *(int *)((long)p + 0x4f30);
                uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
                iStack_a0 = *(int *)((long)p + 0x4f38);
                uStack_8c = *(uint *)((long)p + 0x4f3c);
                uStack_70 = *(uint *)((long)p + 0x4f44);
                uStack_9c = *(uint *)((long)p + 0x4f48);
                uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar32 = *(uint *)((long)p + 0x510);
                uStack_80._0_4_ = *(uint *)((long)p + 0x514);
                puStack_98 = *(uint **)((long)p + 0x498);
                uVar21 = *(ulong *)((long)p + 0x4c8);
                iVar40 = *(int *)((long)p + 0x4d0);
                do {
                  if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_001146a3;
                  uVar36 = 0;
LAB_001146b3:
                  cVar11 = (char)iVar40;
                  iVar40 = iVar40 + 8;
                  uVar21 = uVar21 | uVar36 << (0x38U - cVar11 & 0x3f);
LAB_00114521:
                  if (1 < iVar40) {
                    uVar21 = uVar21 * 4;
                    lVar25 = 0;
                    do {
                      raw_quasi_adaptive_huffman_data_model::init
                                ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar25 + 0x5a0)
                                 ,(EVP_PKEY_CTX *)0x0);
                      lVar25 = lVar25 + 0x80;
                    } while (lVar25 != 0x2000);
                    lVar25 = 0;
                    do {
                      raw_quasi_adaptive_huffman_data_model::init
                                ((raw_quasi_adaptive_huffman_data_model *)
                                 ((long)p + lVar25 + 0x25a0),(EVP_PKEY_CTX *)0x0);
                      lVar25 = lVar25 + 0x80;
                    } while (lVar25 != 0x2000);
                    raw_quasi_adaptive_huffman_data_model::init
                              ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0),
                               (EVP_PKEY_CTX *)0x0);
                    prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4620);
                    lVar25 = 1;
                    do {
                      raw_quasi_adaptive_huffman_data_model::init(prVar47,(EVP_PKEY_CTX *)0x0);
                      raw_quasi_adaptive_huffman_data_model::init
                                ((raw_quasi_adaptive_huffman_data_model *)&prVar47[3].m_codes,
                                 (EVP_PKEY_CTX *)0x0);
                      prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                                &prVar47[1].m_pDecode_tables;
                      lVar25 = lVar25 + -1;
                    } while (lVar25 == 0);
                    prStack_68._0_4_ = iVar40 - 2;
                    raw_quasi_adaptive_huffman_data_model::init
                              ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820),
                               (EVP_PKEY_CTX *)0x0);
                    goto LAB_00114773;
                  }
                  if (puStack_98 != *(uint **)((long)p + 0x4a0)) goto LAB_001146a3;
                } while (*(char *)((long)p + 0x4b0) != '\0');
                *(uint *)((long)p + 0x510) = uVar32;
                *(uint *)((long)p + 0x514) = (uint)uStack_80;
                *(ulong *)((long)p + 0x4c8) = uVar21;
                *(int *)((long)p + 0x4d0) = iVar40;
                *(uint **)((long)p + 0x498) = puStack_98;
                *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
                *(int *)((long)p + 0x4f30) = iStack_6c;
                *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
                *(int *)((long)p + 0x4f38) = iStack_a0;
                *(uint *)((long)p + 0x4f3c) = uStack_8c;
                *(uint *)((long)p + 0x4f44) = uStack_70;
                *(uint *)((long)p + 0x4f48) = uStack_9c;
                *(int *)((long)p + 0x4f18) = (int)uVar49;
              }
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0xff;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
          }
          else {
            if (iVar40 == 0x11a) {
              lVar25 = *(long *)((long)p + 0x550);
              lVar26 = **(long **)((long)p + 0x558);
              *(long *)((long)p + 0x490) = lVar25;
              *(long *)((long)p + 0x498) = lVar25;
              *(long *)((long)p + 0x4a8) = lVar26;
              *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
              *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
              if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
                uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
                iStack_6c = *(int *)((long)p + 0x4f30);
                uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
                iStack_a0 = *(int *)((long)p + 0x4f38);
                uStack_8c = *(uint *)((long)p + 0x4f3c);
                uStack_70 = *(uint *)((long)p + 0x4f44);
                uStack_9c = *(uint *)((long)p + 0x4f48);
                uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar32 = *(uint *)((long)p + 0x510);
                uStack_80._0_4_ = *(uint *)((long)p + 0x514);
                puStack_98 = *(uint **)((long)p + 0x498);
                uVar21 = *(ulong *)((long)p + 0x4c8);
                prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
                goto LAB_001133f6;
              }
LAB_001124b9:
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x11a;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar40 == 0x126) {
              lVar25 = *(long *)((long)p + 0x550);
              lVar26 = **(long **)((long)p + 0x558);
              *(long *)((long)p + 0x490) = lVar25;
              *(long *)((long)p + 0x498) = lVar25;
              *(long *)((long)p + 0x4a8) = lVar26;
              *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
              *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
              if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
                uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
                iStack_6c = *(int *)((long)p + 0x4f30);
                uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
                iStack_a0 = *(int *)((long)p + 0x4f38);
                uStack_8c = *(uint *)((long)p + 0x4f3c);
                uVar14 = *(uint *)((long)p + 0x4f44);
                uStack_9c = *(uint *)((long)p + 0x4f48);
                uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar41 = *(undefined4 *)((long)p + 0x510);
                uVar39 = *(undefined4 *)((long)p + 0x514);
                puStack_98 = *(uint **)((long)p + 0x498);
                uVar21 = *(ulong *)((long)p + 0x4c8);
                uVar32 = *(uint *)((long)p + 0x4d0);
                do {
                  uVar35 = 0;
                  uVar13 = uVar32;
                  if (puStack_98 < *(byte **)((long)p + 0x4a0)) goto LAB_00114fc0;
                  while( true ) {
                    uVar32 = uVar13 + 8;
                    uVar21 = uVar21 | uVar35 << (0x38U - (char)uVar13 & 0x3f);
                    if (0x17 < (int)uVar32) {
                      uVar35 = uVar21 << 0x18;
                      uVar13 = uVar13 - 0x10;
                      uVar42 = (uint)(uVar21 >> 0x28) + 1;
                      if ((uVar32 & 7) != 0) goto LAB_00114e0a;
                      goto LAB_00114e1f;
                    }
                    if (puStack_98 == (uint *)*(byte **)((long)p + 0x4a0)) break;
LAB_00114fc0:
                    uVar35 = (ulong)(byte)*puStack_98;
                    puStack_98 = (uint *)((long)puStack_98 + 1);
                    uVar13 = uVar32;
                  }
                } while (*(char *)((long)p + 0x4b0) != '\0');
                *(undefined4 *)((long)p + 0x510) = uVar41;
                *(undefined4 *)((long)p + 0x514) = uVar39;
                *(ulong *)((long)p + 0x4c8) = uVar21;
                *(uint *)((long)p + 0x4d0) = uVar32;
                *(uint **)((long)p + 0x498) = puStack_98;
                *(undefined4 *)((long)p + 0x4f90) = *(undefined4 *)((long)p + 0x4f90);
                *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
                *(int *)((long)p + 0x4f30) = iStack_6c;
                *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
                *(int *)((long)p + 0x4f38) = iStack_a0;
                *(uint *)((long)p + 0x4f3c) = uStack_8c;
                *(uint *)((long)p + 0x4f44) = uVar14;
                *(uint *)((long)p + 0x4f48) = uStack_9c;
                *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
              }
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x126;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar40 == 0x129) {
              lVar25 = *(long *)((long)p + 0x550);
              lVar26 = **(long **)((long)p + 0x558);
              *(long *)((long)p + 0x490) = lVar25;
              *(long *)((long)p + 0x498) = lVar25;
              *(long *)((long)p + 0x4a8) = lVar26;
              *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
              *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
              if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
                uVar42 = *(uint *)((long)p + 0x4f90);
                uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
                iStack_6c = *(int *)((long)p + 0x4f30);
                uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
                iStack_a0 = *(int *)((long)p + 0x4f38);
                uStack_8c = *(uint *)((long)p + 0x4f3c);
                uVar14 = *(uint *)((long)p + 0x4f44);
                uStack_9c = *(uint *)((long)p + 0x4f48);
                uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar41 = *(undefined4 *)((long)p + 0x510);
                uVar39 = *(undefined4 *)((long)p + 0x514);
                puStack_98 = *(uint **)((long)p + 0x498);
                uVar35 = *(ulong *)((long)p + 0x4c8);
                uVar13 = *(uint *)((long)p + 0x4d0);
                do {
                  uVar21 = 0;
                  if (puStack_98 < *(byte **)((long)p + 0x4a0)) goto LAB_00114ba9;
                  while( true ) {
                    cVar11 = (char)uVar13;
                    uVar13 = uVar13 + 8;
                    uVar35 = uVar35 | uVar21 << (0x38U - cVar11 & 0x3f);
LAB_00114e0a:
                    if (-1 < (int)uVar13) {
                      uVar35 = uVar35 << ((byte)uVar13 & 7);
                      uVar13 = uVar13 & 0x7ffffff8;
                      goto LAB_00114e1f;
                    }
                    if (puStack_98 == (uint *)*(byte **)((long)p + 0x4a0)) break;
LAB_00114ba9:
                    uVar21 = (ulong)(byte)*puStack_98;
                    puStack_98 = (uint *)((long)puStack_98 + 1);
                  }
                } while (*(char *)((long)p + 0x4b0) != '\0');
                *(undefined4 *)((long)p + 0x510) = uVar41;
                *(undefined4 *)((long)p + 0x514) = uVar39;
                *(ulong *)((long)p + 0x4c8) = uVar35;
                *(uint *)((long)p + 0x4d0) = uVar13;
                *(uint **)((long)p + 0x498) = puStack_98;
                *(uint *)((long)p + 0x4f90) = uVar42;
                *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
                *(int *)((long)p + 0x4f30) = iStack_6c;
                *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
                *(int *)((long)p + 0x4f38) = iStack_a0;
                *(uint *)((long)p + 0x4f3c) = uStack_8c;
                *(uint *)((long)p + 0x4f44) = uVar14;
                *(uint *)((long)p + 0x4f48) = uStack_9c;
                *(int *)((long)p + 0x4f18) = (int)uVar49;
              }
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x129;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
          }
          goto switchD_00111d89_caseD_338;
        }
        if (0x155 < iVar40) {
          if (iVar40 == 0x156) {
LAB_00114491:
            *(undefined4 *)p = 0x156;
            return LZHAM_DECOMP_STATUS_FAILED;
          }
          if (iVar40 == 0x15a) {
            uVar42 = *(uint *)((long)p + 0x4f90);
            uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uVar14 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar32 = *(uint *)((long)p + 0x4f18);
            lVar25 = *(long *)((long)p + 0x550);
            uVar21 = **(ulong **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(ulong *)((long)p + 0x4a8) = uVar21;
            *(ulong *)((long)p + 0x4a0) = lVar25 + uVar21;
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            uVar21 = **(ulong **)((long)p + 0x558);
            lVar25 = 0;
            goto LAB_00114365;
          }
          if (iVar40 == 0x16c) {
LAB_001144ba:
            *(undefined4 *)p = 0x16c;
            return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
          }
          goto switchD_00111d89_caseD_338;
        }
        if (iVar40 == 0x137) {
LAB_00114ef6:
          *(undefined4 *)p = 0x137;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar40 != 0x13f) goto switchD_00111d89_caseD_338;
        lVar25 = *(long *)((long)p + 0x550);
        lVar26 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar25;
        *(long *)((long)p + 0x498) = lVar25;
        *(long *)((long)p + 0x4a8) = lVar26;
        *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        pvVar34 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
        *(void **)((long)p + 0x4f50) = pvVar34;
        uVar21 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        *(ulong *)((long)p + 0x4f58) = uVar21;
        if (uVar21 != 0) {
          uVar36 = *puVar6;
          if (uVar21 < *puVar6) {
            uVar36 = uVar21;
          }
          *(ulong *)((long)p + 0x4f60) = uVar36;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(pbVar7,pvVar34,uVar36);
          }
          else {
            uVar36 = *(ulong *)((long)p + 0x4f60);
            if (uVar36 != 0) {
              uVar21 = 0;
              do {
                sVar46 = uVar36 - uVar21;
                if (0x1fff < sVar46) {
                  sVar46 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                       (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                 *(uint *)((long)p + 0x548));
                *(uint *)((long)p + 0x548) = uVar15;
                uVar21 = uVar21 + sVar46;
                uVar36 = *(ulong *)((long)p + 0x4f60);
              } while (uVar21 < uVar36);
            }
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x13f;
          return LZHAM_DECOMP_STATUS_NOT_FINISHED;
        }
        uVar42 = *(uint *)((long)p + 0x4f90);
        uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_6c = *(int *)((long)p + 0x4f30);
        uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
        iStack_a0 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar14 = *(uint *)((long)p + 0x4f44);
        uStack_9c = *(uint *)((long)p + 0x4f48);
        uVar41 = *(undefined4 *)((long)p + 0x510);
        uVar39 = *(undefined4 *)((long)p + 0x514);
        puStack_98 = *(uint **)((long)p + 0x498);
        uVar21 = *(ulong *)((long)p + 0x4c8);
        uVar32 = *(uint *)((long)p + 0x4d0);
        uVar23 = 0;
        while (uVar42 = uVar42 - 1, uVar35 = uVar21, uVar49 = uVar23, uVar13 = uVar32, uVar42 != 0)
        {
LAB_00114e1f:
          uVar21 = uVar35 << 8;
          uVar32 = uVar13 - 8;
          if ((int)uVar13 < 8) goto LAB_00114e3a;
          if (uVar36 <= uVar49) {
            *(undefined4 *)((long)p + 0x510) = uVar41;
            *(undefined4 *)((long)p + 0x514) = uVar39;
            *(ulong *)((long)p + 0x4c8) = uVar21;
            *(uint *)((long)p + 0x4d0) = uVar32;
            *(uint **)((long)p + 0x498) = puStack_98;
            **(long **)((long)p + 0x558) = (long)puStack_98 - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            goto LAB_00114ef6;
          }
          bVar37 = 0xff;
          if (7 < (int)uVar13) {
            bVar37 = (byte)(uVar35 >> 0x38);
          }
          uVar23 = (ulong)((int)uVar49 + 1);
          pbVar7[uVar49] = bVar37;
        }
        uVar42 = 0;
LAB_00114e3a:
        *(undefined4 *)((long)p + 0x510) = uVar41;
        *(undefined4 *)((long)p + 0x514) = uVar39;
        *(ulong *)((long)p + 0x4c8) = uVar35;
        *(uint *)((long)p + 0x4d0) = uVar13;
        *(uint **)((long)p + 0x498) = puStack_98;
      }
      else {
        if (0x1c8 < iVar40) {
          if (iVar40 < 0x1e6) {
            if (iVar40 == 0x1c9) {
              lVar25 = *(long *)((long)p + 0x550);
              lVar26 = **(long **)((long)p + 0x558);
              *(long *)((long)p + 0x490) = lVar25;
              *(long *)((long)p + 0x498) = lVar25;
              *(long *)((long)p + 0x4a8) = lVar26;
              *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
              *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
              if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
                iVar40 = *(int *)((long)p + 0x4f2c);
                uStack_60._4_4_ = *(int *)((long)p + 0x4f30);
                uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
                iStack_a0 = *(int *)((long)p + 0x4f38);
                uVar13 = *(uint *)((long)p + 0x4f3c);
                uVar14 = *(uint *)((long)p + 0x4f44);
                uStack_9c = *(uint *)((long)p + 0x4f48);
                uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
                uVar32 = *(uint *)((long)p + 0x510);
                uStack_80._0_4_ = *(uint *)((long)p + 0x514);
                puStack_98 = *(uint **)((long)p + 0x498);
                uVar35 = *(ulong *)((long)p + 0x4c8);
                prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
                goto LAB_00113962;
              }
LAB_0011297d:
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = 0;
              *(undefined4 *)p = 0x1c9;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
            if (iVar40 == 0x1dd) {
LAB_0011227d:
              *(undefined4 *)p = 0x1dd;
              return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
            }
            goto switchD_00111d89_caseD_338;
          }
          if (iVar40 == 0x1e6) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              iVar40 = *(int *)((long)p + 0x4f2c);
              uStack_60._4_4_ = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar32 = *(uint *)((long)p + 0x510);
              uVar42 = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar21 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              prStack_78 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar24 = prStack_78->m_pDecode_tables;
              goto LAB_00115ade;
            }
LAB_00115c06:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x1e6;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 == 0x206) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f6c);
              iVar40 = *(int *)((long)p + 0x4f2c);
              uStack_60._4_4_ = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar32 = *(uint *)((long)p + 0x510);
              uStack_80._0_4_ = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar21 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar24 = prVar47->m_pDecode_tables;
              goto LAB_00115ca5;
            }
LAB_00115dd7:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x206;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 != 0x21c) goto switchD_00111d89_caseD_338;
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          pvVar34 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
          *(void **)((long)p + 0x4f50) = pvVar34;
          uVar21 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          *(ulong *)((long)p + 0x4f58) = uVar21;
          if (uVar21 != 0) {
            uVar36 = *puVar6;
            if (uVar21 < *puVar6) {
              uVar36 = uVar21;
            }
            *(ulong *)((long)p + 0x4f60) = uVar36;
            if (*(int *)((long)p + 0x594) == 0) {
              memcpy(pbVar7,pvVar34,uVar36);
            }
            else {
              uVar36 = *(ulong *)((long)p + 0x4f60);
              if (uVar36 != 0) {
                uVar21 = 0;
                do {
                  sVar46 = uVar36 - uVar21;
                  if (0x1fff < sVar46) {
                    sVar46 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                         (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                  uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                   *(uint *)((long)p + 0x548));
                  *(uint *)((long)p + 0x548) = uVar15;
                  uVar21 = uVar21 + sVar46;
                  uVar36 = *(ulong *)((long)p + 0x4f60);
                } while (uVar21 < uVar36);
              }
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
            *(undefined4 *)p = 0x21c;
            return LZHAM_DECOMP_STATUS_NOT_FINISHED;
          }
          iVar40 = *(int *)((long)p + 0x4f2c);
          uStack_60._4_4_ = *(int *)((long)p + 0x4f30);
          uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
          iStack_a0 = *(int *)((long)p + 0x4f38);
          uVar13 = *(uint *)((long)p + 0x4f3c);
          uVar14 = *(uint *)((long)p + 0x4f44);
          uStack_9c = *(uint *)((long)p + 0x4f48);
          uVar32 = *(uint *)((long)p + 0x510);
          uStack_80._0_4_ = *(uint *)((long)p + 0x514);
          puStack_98 = *(uint **)((long)p + 0x498);
          uVar21 = *(ulong *)((long)p + 0x4c8);
          prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
LAB_00111d64:
          uVar49 = 0;
          goto LAB_001154b5;
        }
        switch(iVar40) {
        case 0x18d:
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar41 = *(undefined4 *)((long)p + 0x4f2c);
            uVar39 = *(undefined4 *)((long)p + 0x4f30);
            uVar22 = *(undefined4 *)((long)p + 0x4f34);
            iStack_a0 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar43 = *(undefined4 *)((long)p + 0x4f44);
            uVar38 = *(undefined4 *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            iVar27 = *(int *)((long)p + 0x4d0);
            do {
              uVar35 = 0;
              iVar40 = iVar27;
              if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_001150e5;
              while( true ) {
                iVar27 = iVar40 + 8;
                uVar21 = uVar21 | uVar35 << (0x38U - (char)iVar40 & 0x3f);
                if (7 < iVar27) {
                  uVar35 = uVar21 << 8;
                  uVar32 = (uint)(uVar21 >> 0x20) & 0xff000000;
                  goto LAB_0011519c;
                }
                if (puStack_98 == *(uint **)((long)p + 0x4a0)) break;
LAB_001150e5:
                uVar35 = (ulong)(byte)*puStack_98;
                puStack_98 = (uint *)((long)puStack_98 + 1);
                iVar40 = iVar27;
              }
            } while (*(char *)((long)p + 0x4b0) != '\0');
            *(undefined4 *)((long)p + 0x510) = *(undefined4 *)((long)p + 0x510);
            *(uint *)((long)p + 0x514) = (uint)uStack_80;
            *(ulong *)((long)p + 0x4c8) = uVar21;
            *(int *)((long)p + 0x4d0) = iVar27;
            *(uint **)((long)p + 0x498) = puStack_98;
            *(undefined4 *)((long)p + 0x4f2c) = uVar41;
            *(undefined4 *)((long)p + 0x4f30) = uVar39;
            *(undefined4 *)((long)p + 0x4f34) = uVar22;
            *(int *)((long)p + 0x4f38) = iStack_a0;
            *(undefined4 *)((long)p + 0x4f3c) = uVar29;
            *(undefined4 *)((long)p + 0x4f44) = uVar43;
            *(undefined4 *)((long)p + 0x4f48) = uVar38;
            *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x18d;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        case 0x18e:
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar41 = *(undefined4 *)((long)p + 0x4f2c);
            uVar39 = *(undefined4 *)((long)p + 0x4f30);
            uVar22 = *(undefined4 *)((long)p + 0x4f34);
            iStack_a0 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar43 = *(undefined4 *)((long)p + 0x4f44);
            uVar38 = *(undefined4 *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar35 = *(ulong *)((long)p + 0x4c8);
            iVar40 = *(int *)((long)p + 0x4d0);
            goto LAB_00113ba3;
          }
LAB_00112db3:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x18e;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        case 399:
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar41 = *(undefined4 *)((long)p + 0x4f2c);
            uVar39 = *(undefined4 *)((long)p + 0x4f30);
            uVar22 = *(undefined4 *)((long)p + 0x4f34);
            iStack_a0 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar43 = *(undefined4 *)((long)p + 0x4f44);
            uVar38 = *(undefined4 *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            iVar40 = *(int *)((long)p + 0x4d0);
            goto LAB_001131ab;
          }
LAB_00112438:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 399;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        case 400:
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar41 = *(undefined4 *)((long)p + 0x4f2c);
            uVar39 = *(undefined4 *)((long)p + 0x4f30);
            uVar22 = *(undefined4 *)((long)p + 0x4f34);
            iStack_a0 = *(undefined4 *)((long)p + 0x4f38);
            uVar29 = *(undefined4 *)((long)p + 0x4f3c);
            uVar43 = *(undefined4 *)((long)p + 0x4f44);
            uVar38 = *(undefined4 *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar35 = *(ulong *)((long)p + 0x4c8);
            iVar40 = *(int *)((long)p + 0x4d0);
            goto LAB_0011366c;
          }
LAB_00112767:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 400;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 != 0x17c) goto switchD_00111d89_caseD_338;
        lVar25 = *(long *)((long)p + 0x550);
        lVar26 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar25;
        *(long *)((long)p + 0x498) = lVar25;
        *(long *)((long)p + 0x4a8) = lVar26;
        *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        pvVar34 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
        *(void **)((long)p + 0x4f50) = pvVar34;
        uVar21 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        *(ulong *)((long)p + 0x4f58) = uVar21;
        if (uVar21 != 0) {
          uVar36 = *puVar6;
          if (uVar21 < *puVar6) {
            uVar36 = uVar21;
          }
          *(ulong *)((long)p + 0x4f60) = uVar36;
          if (*(int *)((long)p + 0x594) == 0) {
            memcpy(pbVar7,pvVar34,uVar36);
          }
          else {
            uVar36 = *(ulong *)((long)p + 0x4f60);
            if (uVar36 != 0) {
              uVar21 = 0;
              do {
                sVar46 = uVar36 - uVar21;
                if (0x1fff < sVar46) {
                  sVar46 = 0x2000;
                }
                memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                       (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                 *(uint *)((long)p + 0x548));
                *(uint *)((long)p + 0x548) = uVar15;
                uVar21 = uVar21 + sVar46;
                uVar36 = *(ulong *)((long)p + 0x4f60);
              } while (uVar21 < uVar36);
            }
          }
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
          *(undefined4 *)p = 0x17c;
          return LZHAM_DECOMP_STATUS_NOT_FINISHED;
        }
        uVar42 = *(uint *)((long)p + 0x4f90);
        uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_6c = *(int *)((long)p + 0x4f30);
        uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
        iStack_a0 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar14 = *(uint *)((long)p + 0x4f44);
        uStack_9c = *(uint *)((long)p + 0x4f48);
        uVar49 = 0;
      }
      for (; uVar32 = (uint)uVar49, uVar42 != 0; uVar42 = uVar42 - (int)uVar35) {
        lVar25 = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        uVar21 = **(long **)((long)p + 0x558) - lVar25;
LAB_00114365:
        if (uVar21 == 0) {
          **(long **)((long)p + 0x558) = lVar25;
          **(undefined8 **)((long)p + 0x568) = 0;
          if (*(char *)((long)p + 0x570) != '\x01') {
            *(uint *)((long)p + 0x4f90) = uVar42;
            *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_6c;
            *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
            *(int *)((long)p + 0x4f38) = iStack_a0;
            *(uint *)((long)p + 0x4f3c) = uStack_8c;
            *(uint *)((long)p + 0x4f44) = uVar14;
            *(uint *)((long)p + 0x4f48) = uStack_9c;
            *(uint *)((long)p + 0x4f18) = uVar32;
            *(undefined4 *)p = 0x15a;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          goto LAB_00114491;
        }
        uVar35 = (ulong)uVar42;
        if (uVar21 < uVar42) {
          uVar35 = uVar21;
        }
        uVar49 = (ulong)(uVar32 + (int)uVar35);
        if (uVar36 < uVar49) {
          **(long **)((long)p + 0x558) = lVar25;
          **(undefined8 **)((long)p + 0x568) = 0;
          goto LAB_001144ba;
        }
        memcpy(pbVar7 + uVar32,(void *)(*(long *)((long)p + 0x550) + lVar25),uVar35);
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(ulong *)((long)p + 0x498) = lVar25 + lVar26 + uVar35;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      }
      uVar32 = *(uint *)((long)p + 0x510);
      uStack_80._0_4_ = *(uint *)((long)p + 0x514);
      puStack_98 = *(uint **)((long)p + 0x498);
      uVar21 = *(ulong *)((long)p + 0x4c8);
      prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
      goto LAB_00116f51;
    }
    if (iVar40 < 0x29c) {
      if (iVar40 < 0x243) {
        if (iVar40 < 0x231) {
          if (iVar40 == 0x22b) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f70);
              iVar40 = *(int *)((long)p + 0x4f2c);
              iStack_6c = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uStack_8c = *(uint *)((long)p + 0x510);
              uVar42 = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar35 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              goto LAB_0011383c;
            }
LAB_0011287b:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x22b;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 == 0x22e) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f70);
              iVar40 = *(int *)((long)p + 0x4f2c);
              iStack_6c = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar30 = *(uint *)((long)p + 0x510);
              uVar42 = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar35 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              goto LAB_001132c6;
            }
LAB_001120a0:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x22e;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
        else {
          if (iVar40 == 0x231) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f70);
              iVar40 = *(int *)((long)p + 0x4f2c);
              iStack_6c = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar31 = *(uint *)((long)p + 0x510);
              uVar42 = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar35 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              goto LAB_00113491;
            }
LAB_0011253a:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x231;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 == 0x238) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f70);
              iVar40 = *(int *)((long)p + 0x4f2c);
              uStack_60._4_4_ = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uStack_70 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar31 = *(uint *)((long)p + 0x510);
              uStack_80._0_4_ = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar21 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar24 = prVar47->m_pDecode_tables;
              goto LAB_00116522;
            }
LAB_001165e8:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x238;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 == 0x240) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f70);
              iVar40 = *(int *)((long)p + 0x4f2c);
              iStack_6c = *(int *)((long)p + 0x4f30);
              uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
              iStack_a0 = *(int *)((long)p + 0x4f38);
              uVar13 = *(uint *)((long)p + 0x4f3c);
              uVar14 = *(uint *)((long)p + 0x4f44);
              uStack_9c = *(uint *)((long)p + 0x4f48);
              uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar30 = *(uint *)((long)p + 0x510);
              uStack_80._0_4_ = *(uint *)((long)p + 0x514);
              puStack_98 = *(uint **)((long)p + 0x498);
              uVar21 = *(ulong *)((long)p + 0x4c8);
              prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
              prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
              pdVar24 = prVar47->m_pDecode_tables;
              goto LAB_0011402b;
            }
LAB_001140e1:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x240;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
      }
      else if (iVar40 < 0x266) {
        if (iVar40 == 0x243) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar28 = *(uint *)((long)p + 0x4f70);
            iVar40 = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_70 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar30 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar35 = *(ulong *)((long)p + 0x4c8);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
            goto LAB_001138d5;
          }
LAB_001128fc:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x243;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x24c) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar28 = *(uint *)((long)p + 0x4f70);
            uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_70 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar30 = *(uint *)((long)p + 0x510);
            uVar14 = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar35 = *(ulong *)((long)p + 0x4c8);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
            goto LAB_0011335d;
          }
LAB_00112233:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x24c;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else {
        if (iVar40 == 0x266) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar28 = *(uint *)((long)p + 0x4f70);
            iVar40 = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uVar13 = *(uint *)((long)p + 0x4f3c);
            uVar14 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uStack_8c = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
            prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar24 = prVar47->m_pDecode_tables;
            goto LAB_00116735;
          }
LAB_0011688d:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x266;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x285) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            iVar40 = *(int *)((long)p + 0x4f70);
            uVar13 = *(uint *)((long)p + 0x4f74);
            uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uVar14 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
            prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar24 = prVar47->m_pDecode_tables;
            goto LAB_00116a6a;
          }
LAB_00116bbe:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x285;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x295) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar28 = *(uint *)((long)p + 0x4f70);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4f74);
            uVar14 = *(uint *)((long)p + 0x4f7c);
            uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_70 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            uVar13 = *(uint *)((long)p + 0x4d0);
            goto LAB_001135cc;
          }
LAB_00111c25:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x295;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      goto switchD_00111d89_caseD_338;
    }
    if (iVar40 < 0x325) {
      if (iVar40 < 0x2c2) {
        if (iVar40 == 0x29c) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar28 = *(uint *)((long)p + 0x4f70);
            uVar42 = *(uint *)((long)p + 0x4f74);
            uVar14 = *(uint *)((long)p + 0x4f7c);
            uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_70 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
            goto LAB_00113105;
          }
LAB_001122f5:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x29c;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x2a5) {
          lVar25 = *(long *)((long)p + 0x550);
          lVar26 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar25;
          *(long *)((long)p + 0x498) = lVar25;
          *(long *)((long)p + 0x4a8) = lVar26;
          *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
            uVar28 = *(uint *)((long)p + 0x4f70);
            uVar42 = *(uint *)((long)p + 0x4f74);
            iVar40 = *(int *)((long)p + 0x4f78);
            uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
            iStack_6c = *(int *)((long)p + 0x4f30);
            uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
            iStack_a0 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uStack_70 = *(uint *)((long)p + 0x4f44);
            uStack_9c = *(uint *)((long)p + 0x4f48);
            uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar32 = *(uint *)((long)p + 0x510);
            uStack_80._0_4_ = *(uint *)((long)p + 0x514);
            puStack_98 = *(uint **)((long)p + 0x498);
            uVar21 = *(ulong *)((long)p + 0x4c8);
            prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
            prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar24 = prVar47->m_pDecode_tables;
            goto LAB_00114208;
          }
LAB_001142d5:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x2a5;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        goto switchD_00111d89_caseD_338;
      }
      if (iVar40 == 0x2c2) {
LAB_00116190:
        *(undefined4 *)p = 0x2c2;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
      }
      if (iVar40 != 0x2df) goto switchD_00111d89_caseD_338;
      lVar25 = *(long *)((long)p + 0x550);
      lVar26 = **(long **)((long)p + 0x558);
      *(long *)((long)p + 0x490) = lVar25;
      *(long *)((long)p + 0x498) = lVar25;
      *(long *)((long)p + 0x4a8) = lVar26;
      *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar34 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar34;
      uVar21 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
      *(ulong *)((long)p + 0x4f58) = uVar21;
      if (uVar21 != 0) {
        uVar36 = *puVar6;
        if (uVar21 < *puVar6) {
          uVar36 = uVar21;
        }
        *(ulong *)((long)p + 0x4f60) = uVar36;
        if (*(int *)((long)p + 0x594) == 0) {
          memcpy(pbVar7,pvVar34,uVar36);
        }
        else {
          uVar36 = *(ulong *)((long)p + 0x4f60);
          if (uVar36 != 0) {
            uVar21 = 0;
            do {
              sVar46 = uVar36 - uVar21;
              if (0x1fff < sVar46) {
                sVar46 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
              uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar15;
              uVar21 = uVar21 + sVar46;
              uVar36 = *(ulong *)((long)p + 0x4f60);
            } while (uVar21 < uVar36);
          }
        }
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
        *(undefined4 *)p = 0x2df;
        return LZHAM_DECOMP_STATUS_NOT_FINISHED;
      }
      iVar27 = *(int *)((long)p + 0x4f70);
      iVar40 = *(int *)((long)p + 0x4f2c);
      uStack_60._4_4_ = *(int *)((long)p + 0x4f30);
      uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
      iStack_a0 = *(int *)((long)p + 0x4f38);
      uVar13 = *(uint *)((long)p + 0x4f3c);
      uVar14 = *(uint *)((long)p + 0x4f44);
      uVar32 = *(uint *)((long)p + 0x510);
      uStack_80._0_4_ = *(uint *)((long)p + 0x514);
      puStack_98 = *(uint **)((long)p + 0x498);
      uVar21 = *(ulong *)((long)p + 0x4c8);
      prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
      if (iVar27 == 1) {
        uStack_9c = *(uint *)((long)p + 0x4f48);
        goto LAB_00111d64;
      }
      pbVar44 = *(byte **)((long)p + 0x4f88);
      uVar49 = 0;
      do {
        uStack_9c = uVar14;
        uVar14 = (uint)*pbVar44;
        pbVar45 = pbVar44 + 1;
        pbVar7[uVar49] = *pbVar44;
        pbVar44 = pbVar45;
        if (pbVar45 == pbVar7 + uVar36) {
          pbVar44 = pbVar7;
        }
        uVar49 = uVar49 + 1;
      } while (iVar27 + -1 != (int)uVar49);
      goto LAB_001154b5;
    }
    switch(iVar40) {
    case 0x337:
      lVar25 = *(long *)((long)p + 0x550);
      lVar26 = **(long **)((long)p + 0x558);
      *(long *)((long)p + 0x490) = lVar25;
      *(long *)((long)p + 0x498) = lVar25;
      *(long *)((long)p + 0x4a8) = lVar26;
      *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
      *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
      pvVar34 = (void *)(*(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60));
      *(void **)((long)p + 0x4f50) = pvVar34;
      uVar36 = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
      *(ulong *)((long)p + 0x4f58) = uVar36;
      if (uVar36 != 0) {
        uVar21 = *puVar6;
        if (uVar36 < *puVar6) {
          uVar21 = uVar36;
        }
        *(ulong *)((long)p + 0x4f60) = uVar21;
        if (*(int *)((long)p + 0x594) == 0) {
          memcpy(pbVar7,pvVar34,uVar21);
        }
        else {
          uVar36 = *(ulong *)((long)p + 0x4f60);
          if (uVar36 != 0) {
            uVar21 = 0;
            do {
              sVar46 = uVar36 - uVar21;
              if (0x1fff < sVar46) {
                sVar46 = 0x2000;
              }
              memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                     (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
              uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                               *(uint *)((long)p + 0x548));
              *(uint *)((long)p + 0x548) = uVar15;
              uVar21 = uVar21 + sVar46;
              uVar36 = *(ulong *)((long)p + 0x4f60);
            } while (uVar21 < uVar36);
          }
        }
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
        *(undefined4 *)p = 0x337;
        return LZHAM_DECOMP_STATUS_NOT_FINISHED;
      }
      uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
      iStack_6c = *(int *)((long)p + 0x4f30);
      uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
      iStack_a0 = *(int *)((long)p + 0x4f38);
      uStack_8c = *(uint *)((long)p + 0x4f3c);
      uVar14 = *(uint *)((long)p + 0x4f44);
      uStack_9c = *(uint *)((long)p + 0x4f48);
      uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
      uVar32 = *(uint *)((long)p + 0x510);
      uStack_80._0_4_ = *(uint *)((long)p + 0x514);
      puStack_98 = *(uint **)((long)p + 0x498);
      uVar21 = *(ulong *)((long)p + 0x4c8);
      prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
      goto LAB_00116f6b;
    case 0x338:
    case 0x339:
    case 0x33a:
    case 0x33b:
    case 0x33c:
    case 0x33e:
      goto switchD_00111d89_caseD_338;
    case 0x33d:
      lVar25 = *(long *)((long)p + 0x550);
      lVar26 = **(long **)((long)p + 0x558);
      *(long *)((long)p + 0x490) = lVar25;
      *(long *)((long)p + 0x498) = lVar25;
      *(long *)((long)p + 0x4a8) = lVar26;
      *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
      *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
      if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
        uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_6c = *(int *)((long)p + 0x4f30);
        uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
        iStack_a0 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar14 = *(uint *)((long)p + 0x4f44);
        uStack_9c = *(uint *)((long)p + 0x4f48);
        uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar32 = *(uint *)((long)p + 0x510);
        uStack_80._0_4_ = *(uint *)((long)p + 0x514);
        puStack_98 = *(uint **)((long)p + 0x498);
        uVar21 = *(ulong *)((long)p + 0x4c8);
        prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
        goto LAB_00113cc9;
      }
LAB_00112eb5:
      **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x33d;
      break;
    case 0x33f:
      lVar25 = *(long *)((long)p + 0x550);
      lVar26 = **(long **)((long)p + 0x558);
      *(long *)((long)p + 0x490) = lVar25;
      *(long *)((long)p + 0x498) = lVar25;
      *(long *)((long)p + 0x4a8) = lVar26;
      *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
      *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
      if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
        uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_6c = *(int *)((long)p + 0x4f30);
        uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
        iStack_a0 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar14 = *(uint *)((long)p + 0x4f44);
        uStack_9c = *(uint *)((long)p + 0x4f48);
        uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar32 = *(uint *)((long)p + 0x510);
        uStack_80._0_4_ = *(uint *)((long)p + 0x514);
        puStack_98 = *(uint **)((long)p + 0x498);
        uVar21 = *(ulong *)((long)p + 0x4c8);
        prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
        goto LAB_00113e05;
      }
LAB_00112f36:
      **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x33f;
      break;
    case 0x340:
      lVar25 = *(long *)((long)p + 0x550);
      lVar26 = **(long **)((long)p + 0x558);
      *(long *)((long)p + 0x490) = lVar25;
      *(long *)((long)p + 0x498) = lVar25;
      *(long *)((long)p + 0x4a8) = lVar26;
      *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
      *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
      if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
        uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
        iStack_6c = *(int *)((long)p + 0x4f30);
        uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
        iStack_a0 = *(int *)((long)p + 0x4f38);
        uStack_8c = *(uint *)((long)p + 0x4f3c);
        uVar14 = *(uint *)((long)p + 0x4f44);
        uStack_9c = *(uint *)((long)p + 0x4f48);
        uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar32 = *(uint *)((long)p + 0x510);
        uStack_80._0_4_ = *(uint *)((long)p + 0x514);
        puStack_98 = *(uint **)((long)p + 0x498);
        uVar36 = *(ulong *)((long)p + 0x4c8);
        iVar40 = *(int *)((long)p + 0x4d0);
        goto LAB_00113c2c;
      }
LAB_00112e34:
      **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x340;
      break;
    default:
      if (iVar40 == 0x325) {
        lVar25 = *(long *)((long)p + 0x550);
        lVar26 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar25;
        *(long *)((long)p + 0x498) = lVar25;
        *(long *)((long)p + 0x4a8) = lVar26;
        *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
          uStack_60._4_4_ = *(int *)((long)p + 0x4f2c);
          iStack_6c = *(int *)((long)p + 0x4f30);
          uStack_80._4_4_ = *(int *)((long)p + 0x4f34);
          iStack_a0 = *(int *)((long)p + 0x4f38);
          uStack_8c = *(uint *)((long)p + 0x4f3c);
          uVar14 = *(uint *)((long)p + 0x4f44);
          uStack_9c = *(uint *)((long)p + 0x4f48);
          uVar49 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar32 = *(uint *)((long)p + 0x510);
          uStack_80._0_4_ = *(uint *)((long)p + 0x514);
          puStack_98 = *(uint **)((long)p + 0x498);
          uVar21 = *(ulong *)((long)p + 0x4c8);
          prStack_68._0_4_ = *(uint *)((long)p + 0x4d0);
          do {
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00116f91;
            uVar36 = 0;
            while( true ) {
              cVar11 = (char)(uint)prStack_68;
              prStack_68._0_4_ = (uint)prStack_68 + 8;
              uVar21 = uVar21 | uVar36 << (0x38U - cVar11 & 0x3f);
LAB_00116f3c:
              if (-1 < (int)(uint)prStack_68) {
                uVar21 = uVar21 << ((byte)(uint)prStack_68 & 7);
                prStack_68._0_4_ = (uint)prStack_68 & 0x7ffffff8;
                goto LAB_00116f51;
              }
              if (puStack_98 == *(uint **)((long)p + 0x4a0)) break;
LAB_00116f91:
              uVar36 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
          } while (*(char *)((long)p + 0x4b0) != '\0');
          *(uint *)((long)p + 0x510) = uVar32;
          *(uint *)((long)p + 0x514) = (uint)uStack_80;
          *(ulong *)((long)p + 0x4c8) = uVar21;
          *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_6c;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(uint *)((long)p + 0x4f44) = uVar14;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
        }
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x325;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 != 0x35c) goto switchD_00111d89_caseD_338;
      goto LAB_0011733c;
    }
    return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
  }
  lVar25 = 1L << (*(byte *)((long)p + 0x58c) & 0x3f);
  uVar32 = (int)lVar25 - 1;
  pbVar7 = *(byte **)((long)p + 0x540);
  iVar40 = *p;
  if (iVar40 < 0x22b) {
    if (iVar40 < 0x17c) {
      if (iVar40 < 0x137) {
        if (iVar40 < 0x11a) {
          if (iVar40 == 0) {
            uStack_80 = 0;
            bVar10 = symbol_codec::start_decoding
                               ((symbol_codec *)((long)p + 0x490),*(uint8 **)((long)p + 0x550),
                                **(size_t **)((long)p + 0x558),*(bool *)((long)p + 0x570),
                                (need_bytes_func_ptr)0x0,(void *)0x0);
            if (bVar10) {
              uVar28 = *(uint *)((long)p + 0x510);
              uStack_9c = *(uint *)((long)p + 0x514);
              uStack_60 = *(uint **)((long)p + 0x498);
              uStack_58 = *(ulong *)((long)p + 0x4c8);
              iVar40 = *(int *)((long)p + 0x4d0);
              uStack_a8 = 0;
              uStack_a4 = 0;
              uStack_8c = 0;
              iVar17 = 0;
              iVar33 = 0;
              iStack_a0 = 0;
              iStack_84 = 0;
              goto LAB_00119cbb;
            }
            return LZHAM_DECOMP_STATUS_FAILED;
          }
          if (iVar40 == 0xff) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              iStack_84 = *(int *)((long)p + 0x4f2c);
              iStack_a0 = *(int *)((long)p + 0x4f30);
              iVar33 = *(int *)((long)p + 0x4f34);
              iVar17 = *(int *)((long)p + 0x4f38);
              uStack_8c = *(uint *)((long)p + 0x4f3c);
              uStack_a4 = *(uint *)((long)p + 0x4f44);
              uStack_a8 = *(uint *)((long)p + 0x4f48);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar28 = *(uint *)((long)p + 0x510);
              uStack_9c = *(uint *)((long)p + 0x514);
              uStack_60 = *(uint **)((long)p + 0x498);
              uStack_58 = *(ulong *)((long)p + 0x4c8);
              iVar40 = *(int *)((long)p + 0x4d0);
              do {
                if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_00119e3c;
                uVar36 = 0;
LAB_00119e4c:
                cVar11 = (char)iVar40;
                iVar40 = iVar40 + 8;
                uStack_58 = uStack_58 | uVar36 << (0x38U - cVar11 & 0x3f);
LAB_00119cbb:
                if (1 < iVar40) {
                  uStack_58 = uStack_58 * 4;
                  lVar25 = 0;
                  do {
                    raw_quasi_adaptive_huffman_data_model::init
                              ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar25 + 0x5a0),
                               (EVP_PKEY_CTX *)0x0);
                    lVar25 = lVar25 + 0x80;
                  } while (lVar25 != 0x2000);
                  lVar25 = 0;
                  do {
                    raw_quasi_adaptive_huffman_data_model::init
                              ((raw_quasi_adaptive_huffman_data_model *)((long)p + lVar25 + 0x25a0),
                               (EVP_PKEY_CTX *)0x0);
                    lVar25 = lVar25 + 0x80;
                  } while (lVar25 != 0x2000);
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0),
                             (EVP_PKEY_CTX *)0x0);
                  prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4620);
                  lVar25 = 1;
                  do {
                    raw_quasi_adaptive_huffman_data_model::init(prVar47,(EVP_PKEY_CTX *)0x0);
                    raw_quasi_adaptive_huffman_data_model::init
                              ((raw_quasi_adaptive_huffman_data_model *)&prVar47[3].m_codes,
                               (EVP_PKEY_CTX *)0x0);
                    prVar47 = (raw_quasi_adaptive_huffman_data_model *)&prVar47[1].m_pDecode_tables;
                    lVar25 = lVar25 + -1;
                  } while (lVar25 == 0);
                  uVar14 = iVar40 - 2;
                  raw_quasi_adaptive_huffman_data_model::init
                            ((raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820),
                             (EVP_PKEY_CTX *)0x0);
                  uVar42 = uStack_8c;
                  goto LAB_00119f21;
                }
                if (uStack_60 != *(uint **)((long)p + 0x4a0)) goto LAB_00119e3c;
              } while (*(char *)((long)p + 0x4b0) != '\0');
              *(uint *)((long)p + 0x510) = uVar28;
              *(uint *)((long)p + 0x514) = uStack_9c;
              *(ulong *)((long)p + 0x4c8) = uStack_58;
              *(int *)((long)p + 0x4d0) = iVar40;
              *(uint **)((long)p + 0x498) = uStack_60;
              *(int *)((long)p + 0x4f2c) = iStack_84;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iVar33;
              *(int *)((long)p + 0x4f38) = iVar17;
              *(uint *)((long)p + 0x4f3c) = uStack_8c;
              *(uint *)((long)p + 0x4f44) = uStack_a4;
              *(uint *)((long)p + 0x4f48) = uStack_a8;
              *(int *)((long)p + 0x4f18) = (int)uStack_80;
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0xff;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
        else {
          if (iVar40 == 0x11a) {
            lVar25 = *(long *)((long)p + 0x550);
            lVar26 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar25;
            *(long *)((long)p + 0x498) = lVar25;
            *(long *)((long)p + 0x4a8) = lVar26;
            *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
              iStack_84 = *(int *)((long)p + 0x4f2c);
              iStack_a0 = *(int *)((long)p + 0x4f30);
              iVar33 = *(int *)((long)p + 0x4f34);
              iVar17 = *(int *)((long)p + 0x4f38);
              uVar42 = *(uint *)((long)p + 0x4f3c);
              uStack_a4 = *(uint *)((long)p + 0x4f44);
              uStack_a8 = *(uint *)((long)p + 0x4f48);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar28 = *(uint *)((long)p + 0x510);
              uStack_9c = *(uint *)((long)p + 0x514);
              uStack_60 = *(uint **)((long)p + 0x498);
              uStack_58 = *(ulong *)((long)p + 0x4c8);
              uVar14 = *(uint *)((long)p + 0x4d0);
              goto LAB_00119072;
            }
LAB_0011812c:
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x11a;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 == 0x126) {
            lVar26 = *(long *)((long)p + 0x550);
            lVar8 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar26;
            *(long *)((long)p + 0x498) = lVar26;
            *(long *)((long)p + 0x4a8) = lVar8;
            *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
              iStack_84 = *(int *)((long)p + 0x4f2c);
              iStack_a0 = *(int *)((long)p + 0x4f30);
              iVar33 = *(int *)((long)p + 0x4f34);
              iVar17 = *(int *)((long)p + 0x4f38);
              uVar42 = *(uint *)((long)p + 0x4f3c);
              uStack_a4 = *(uint *)((long)p + 0x4f44);
              uStack_a8 = *(uint *)((long)p + 0x4f48);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar41 = *(undefined4 *)((long)p + 0x510);
              uStack_9c = *(undefined4 *)((long)p + 0x514);
              pbVar44 = *(byte **)((long)p + 0x498);
              uStack_58 = *(ulong *)((long)p + 0x4c8);
              uVar14 = *(uint *)((long)p + 0x4d0);
              do {
                uVar36 = 0;
                uVar13 = uVar14;
                if (pbVar44 < *(byte **)((long)p + 0x4a0)) goto LAB_0011a7f3;
                while( true ) {
                  uVar14 = uVar13 + 8;
                  uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar13 & 0x3f);
                  if (0x17 < (int)uVar14) {
                    uVar36 = uStack_58 << 0x18;
                    uVar13 = uVar13 - 0x10;
                    uVar28 = (uint)(uStack_58 >> 0x28) + 1;
                    if ((uVar14 & 7) != 0) goto LAB_0011a72c;
                    goto LAB_0011a8fd;
                  }
                  if (pbVar44 == *(byte **)((long)p + 0x4a0)) break;
LAB_0011a7f3:
                  uVar36 = (ulong)*pbVar44;
                  pbVar44 = pbVar44 + 1;
                  uVar13 = uVar14;
                }
              } while (*(char *)((long)p + 0x4b0) != '\0');
              *(undefined4 *)((long)p + 0x510) = uVar41;
              *(uint *)((long)p + 0x514) = uStack_9c;
              *(ulong *)((long)p + 0x4c8) = uStack_58;
              *(uint *)((long)p + 0x4d0) = uVar14;
              *(byte **)((long)p + 0x498) = pbVar44;
              *(undefined4 *)((long)p + 0x4f90) = *(undefined4 *)((long)p + 0x4f90);
              *(int *)((long)p + 0x4f2c) = iStack_84;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iVar33;
              *(int *)((long)p + 0x4f38) = iVar17;
              *(uint *)((long)p + 0x4f3c) = uVar42;
              *(uint *)((long)p + 0x4f44) = uStack_a4;
              *(uint *)((long)p + 0x4f48) = uStack_a8;
              *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x126;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
          if (iVar40 == 0x129) {
            lVar26 = *(long *)((long)p + 0x550);
            lVar8 = **(long **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar26;
            *(long *)((long)p + 0x498) = lVar26;
            *(long *)((long)p + 0x4a8) = lVar8;
            *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
            *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
            if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
              uVar28 = *(uint *)((long)p + 0x4f90);
              iStack_84 = *(int *)((long)p + 0x4f2c);
              iStack_a0 = *(int *)((long)p + 0x4f30);
              iVar33 = *(int *)((long)p + 0x4f34);
              iVar17 = *(int *)((long)p + 0x4f38);
              uVar42 = *(uint *)((long)p + 0x4f3c);
              uStack_a4 = *(uint *)((long)p + 0x4f44);
              uStack_a8 = *(uint *)((long)p + 0x4f48);
              uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
              uVar41 = *(undefined4 *)((long)p + 0x510);
              uStack_9c = *(undefined4 *)((long)p + 0x514);
              pbVar44 = *(byte **)((long)p + 0x498);
              uVar13 = *(uint *)((long)p + 0x4d0);
              uStack_58 = *(ulong *)((long)p + 0x4c8);
              do {
                uVar21 = 0;
                uVar36 = uStack_58;
                if (pbVar44 < *(byte **)((long)p + 0x4a0)) goto LAB_0011a4fe;
                while( true ) {
                  cVar11 = (char)uVar13;
                  uVar13 = uVar13 + 8;
                  uVar36 = uStack_58 | uVar21 << (0x38U - cVar11 & 0x3f);
LAB_0011a72c:
                  if (-1 < (int)uVar13) {
                    uVar36 = uVar36 << ((byte)uVar13 & 7);
                    uVar13 = uVar13 & 0x7ffffff8;
                    goto LAB_0011a8fd;
                  }
                  if (pbVar44 == *(byte **)((long)p + 0x4a0)) break;
LAB_0011a4fe:
                  uVar21 = (ulong)*pbVar44;
                  pbVar44 = pbVar44 + 1;
                  uStack_58 = uVar36;
                }
                uStack_58 = uVar36;
              } while (*(char *)((long)p + 0x4b0) != '\0');
              *(undefined4 *)((long)p + 0x510) = uVar41;
              *(uint *)((long)p + 0x514) = uStack_9c;
              *(ulong *)((long)p + 0x4c8) = uVar36;
              *(uint *)((long)p + 0x4d0) = uVar13;
              *(byte **)((long)p + 0x498) = pbVar44;
              *(uint *)((long)p + 0x4f90) = uVar28;
              *(int *)((long)p + 0x4f2c) = iStack_84;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iVar33;
              *(int *)((long)p + 0x4f38) = iVar17;
              *(uint *)((long)p + 0x4f3c) = uVar42;
              *(uint *)((long)p + 0x4f44) = uStack_a4;
              *(uint *)((long)p + 0x4f48) = uStack_a8;
              *(int *)((long)p + 0x4f18) = (int)uStack_80;
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = 0;
            *(undefined4 *)p = 0x129;
            return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
          }
        }
      }
      else {
        if (0x155 < iVar40) {
          if (iVar40 != 0x156) {
            if (iVar40 != 0x15a) {
              if (iVar40 == 0x16c) {
                *(undefined4 *)p = 0x16c;
                return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
              }
              goto switchD_00117a53_caseD_338;
            }
            uVar28 = *(uint *)((long)p + 0x4f90);
            iStack_84 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uVar42 = *(uint *)((long)p + 0x4f3c);
            uStack_a4 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
            lVar26 = *(long *)((long)p + 0x550);
            uVar36 = **(ulong **)((long)p + 0x558);
            *(long *)((long)p + 0x490) = lVar26;
            *(long *)((long)p + 0x498) = lVar26;
            *(ulong *)((long)p + 0x4a8) = uVar36;
            *(ulong *)((long)p + 0x4a0) = lVar26 + uVar36;
            *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
            uVar36 = **(ulong **)((long)p + 0x558);
            lVar26 = 0;
LAB_0011a078:
            iVar40 = (int)uStack_80;
            if (uVar36 != 0) {
              uVar14 = uVar28;
              if (uVar36 < uVar28) {
                uVar14 = (uint)uVar36;
              }
              uVar13 = (int)lVar25 - iVar40;
              if (uVar14 <= uVar13) {
                uVar13 = uVar14;
              }
              memcpy(pbVar7 + uStack_80,(void *)(*(long *)((long)p + 0x550) + lVar26),(ulong)uVar13)
              ;
              uVar28 = uVar28 - uVar13;
              lVar8 = *(long *)((long)p + 0x550);
              lVar9 = **(long **)((long)p + 0x558);
              *(long *)((long)p + 0x490) = lVar8;
              *(ulong *)((long)p + 0x498) = lVar26 + lVar8 + (ulong)uVar13;
              *(long *)((long)p + 0x4a8) = lVar9;
              *(long *)((long)p + 0x4a0) = lVar8 + lVar9;
              *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
              uVar13 = uVar13 + iVar40;
              if (uVar32 < uVar13) {
                *(uint *)((long)p + 0x4f90) = uVar28;
                *(int *)((long)p + 0x4f2c) = iStack_84;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iVar33;
                *(int *)((long)p + 0x4f38) = iVar17;
                *(uint *)((long)p + 0x4f3c) = uVar42;
                *(uint *)((long)p + 0x4f44) = uStack_a4;
                *(uint *)((long)p + 0x4f48) = uStack_a8;
                *(uint *)((long)p + 0x4f18) = uVar13;
                *(undefined8 *)((long)p + 0x4f50) = *(undefined8 *)((long)p + 0x540);
                *(long *)((long)p + 0x4f58) = lVar25;
LAB_00119b7c:
                uVar36 = *(ulong *)((long)p + 0x4f58);
                if (uVar36 != 0) {
                  uVar21 = **(ulong **)((long)p + 0x568);
                  if (uVar36 < **(ulong **)((long)p + 0x568)) {
                    uVar21 = uVar36;
                  }
                  *(ulong *)((long)p + 0x4f60) = uVar21;
                  if (*(int *)((long)p + 0x594) == 0) {
                    memcpy(*(void **)((long)p + 0x560),*(void **)((long)p + 0x4f50),uVar21);
                  }
                  else {
                    uVar36 = *(ulong *)((long)p + 0x4f60);
                    if (uVar36 != 0) {
                      uVar21 = 0;
                      do {
                        sVar46 = uVar36 - uVar21;
                        if (0x1fff < sVar46) {
                          sVar46 = 0x2000;
                        }
                        memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                               (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                        uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                         *(uint *)((long)p + 0x548));
                        *(uint *)((long)p + 0x548) = uVar15;
                        uVar21 = uVar21 + sVar46;
                        uVar36 = *(ulong *)((long)p + 0x4f60);
                      } while (uVar21 < uVar36);
                    }
                  }
                  **(long **)((long)p + 0x558) =
                       *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
                  **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
                  *(undefined4 *)p = 0x17c;
                  return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                }
                uVar28 = *(uint *)((long)p + 0x4f90);
                iStack_84 = *(int *)((long)p + 0x4f2c);
                iStack_a0 = *(int *)((long)p + 0x4f30);
                iVar33 = *(int *)((long)p + 0x4f34);
                iVar17 = *(int *)((long)p + 0x4f38);
                uVar42 = *(uint *)((long)p + 0x4f3c);
                uStack_a4 = *(uint *)((long)p + 0x4f44);
                uStack_a8 = *(uint *)((long)p + 0x4f48);
                uStack_80 = 0;
              }
              else {
                uStack_80 = (ulong)uVar13;
              }
LAB_0011aaa2:
              if (uVar28 != 0) goto code_r0x0011aaa7;
              uVar28 = *(uint *)((long)p + 0x510);
              uStack_9c = *(uint *)((long)p + 0x514);
              uStack_60 = *(uint **)((long)p + 0x498);
              uStack_58 = *(ulong *)((long)p + 0x4c8);
              uVar14 = *(uint *)((long)p + 0x4d0);
LAB_0011ca05:
              *(int *)((long)p + 0x4f28) = *(int *)((long)p + 0x4f28) + 1;
              if (*(int *)((long)p + 0x598) == 0) {
LAB_00119f21:
                do {
                  if (1 < (int)uVar14) {
                    *(uint *)((long)p + 0x4f4c) = (uint)(uStack_58 >> 0x3e);
                    lVar12 = (*(code *)(&DAT_00122d58 +
                                       *(int *)(&DAT_00122d58 + (uStack_58 >> 0x3e) * 4)))
                                       (uVar28,iVar33,&DAT_00122d58,
                                        &DAT_00122d58 +
                                        *(int *)(&DAT_00122d58 + (uStack_58 >> 0x3e) * 4),pbVar7);
                    return lVar12;
                  }
                  if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(uint *)((long)p + 0x510) = uVar28;
                      *(uint *)((long)p + 0x514) = uStack_9c;
                      *(ulong *)((long)p + 0x4c8) = uStack_58;
                      *(uint *)((long)p + 0x4d0) = uVar14;
                      *(uint **)((long)p + 0x498) = uStack_60;
                      *(int *)((long)p + 0x4f2c) = iStack_84;
                      *(int *)((long)p + 0x4f30) = iStack_a0;
                      *(int *)((long)p + 0x4f34) = iVar33;
                      *(int *)((long)p + 0x4f38) = iVar17;
                      *(uint *)((long)p + 0x4f3c) = uVar42;
                      *(uint *)((long)p + 0x4f44) = uStack_a4;
                      *(uint *)((long)p + 0x4f48) = uStack_a8;
                      *(int *)((long)p + 0x4f18) = (int)uStack_80;
                      goto LAB_0011812c;
                    }
LAB_00119072:
                    uVar36 = 0;
                    if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_00119fa3;
                  }
                  else {
LAB_00119fa3:
                    uVar36 = (ulong)(byte)*uStack_60;
                    uStack_60 = (uint *)((long)uStack_60 + 1);
                  }
                  cVar11 = (char)uVar14;
                  uVar14 = uVar14 + 8;
                  uStack_58 = uStack_58 | uVar36 << (0x38U - cVar11 & 0x3f);
                } while( true );
              }
              if ((int)uStack_80 != 0) {
                *(uint *)((long)p + 0x510) = uVar28;
                *(uint *)((long)p + 0x514) = uStack_9c;
                *(ulong *)((long)p + 0x4c8) = uStack_58;
                *(uint *)((long)p + 0x4d0) = uVar14;
                *(uint **)((long)p + 0x498) = uStack_60;
                *(int *)((long)p + 0x4f2c) = iStack_84;
                *(int *)((long)p + 0x4f30) = iStack_a0;
                *(int *)((long)p + 0x4f34) = iVar33;
                *(int *)((long)p + 0x4f38) = iVar17;
                *(uint *)((long)p + 0x4f3c) = uVar42;
                *(uint *)((long)p + 0x4f44) = uStack_a4;
                *(uint *)((long)p + 0x4f48) = uStack_a8;
                *(int *)((long)p + 0x4f18) = (int)uStack_80;
                *(undefined8 *)((long)p + 0x4f50) = *(undefined8 *)((long)p + 0x540);
                *(ulong *)((long)p + 0x4f58) = uStack_80;
                goto LAB_0011caac;
              }
              uVar41 = 0;
              goto LAB_0011cbd6;
            }
            **(long **)((long)p + 0x558) = lVar26;
            **(undefined8 **)((long)p + 0x568) = 0;
            if (*(char *)((long)p + 0x570) != '\x01') {
              *(uint *)((long)p + 0x4f90) = uVar28;
              *(int *)((long)p + 0x4f2c) = iStack_84;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iVar33;
              *(int *)((long)p + 0x4f38) = iVar17;
              *(uint *)((long)p + 0x4f3c) = uVar42;
              *(uint *)((long)p + 0x4f44) = uStack_a4;
              *(uint *)((long)p + 0x4f48) = uStack_a8;
              *(int *)((long)p + 0x4f18) = iVar40;
              *(undefined4 *)p = 0x15a;
              return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
            }
          }
          *(undefined4 *)p = 0x156;
          return LZHAM_DECOMP_STATUS_FAILED;
        }
        if (iVar40 == 0x137) {
          *(undefined4 *)p = 0x137;
          return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
        }
        if (iVar40 == 0x13f) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          *(long *)((long)p + 0x4f50) = *(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60);
          *(long *)((long)p + 0x4f58) = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          do {
            uVar36 = *(ulong *)((long)p + 0x4f58);
            if (uVar36 != 0) {
              uVar21 = **(ulong **)((long)p + 0x568);
              if (uVar36 < **(ulong **)((long)p + 0x568)) {
                uVar21 = uVar36;
              }
              *(ulong *)((long)p + 0x4f60) = uVar21;
              if (*(int *)((long)p + 0x594) == 0) {
                memcpy(*(void **)((long)p + 0x560),*(void **)((long)p + 0x4f50),uVar21);
              }
              else {
                uVar36 = *(ulong *)((long)p + 0x4f60);
                if (uVar36 != 0) {
                  uVar21 = 0;
                  do {
                    sVar46 = uVar36 - uVar21;
                    if (0x1fff < sVar46) {
                      sVar46 = 0x2000;
                    }
                    memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                           (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                    uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                     *(uint *)((long)p + 0x548));
                    *(uint *)((long)p + 0x548) = uVar15;
                    uVar21 = uVar21 + sVar46;
                    uVar36 = *(ulong *)((long)p + 0x4f60);
                  } while (uVar21 < uVar36);
                }
              }
              **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490)
              ;
              **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
              *(undefined4 *)p = 0x13f;
              return LZHAM_DECOMP_STATUS_NOT_FINISHED;
            }
            uVar28 = *(uint *)((long)p + 0x4f90);
            iStack_84 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uVar42 = *(uint *)((long)p + 0x4f3c);
            uStack_a4 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uVar41 = *(undefined4 *)((long)p + 0x510);
            uStack_9c = *(undefined4 *)((long)p + 0x514);
            pbVar44 = *(byte **)((long)p + 0x498);
            uStack_80 = 0;
            uVar36 = *(ulong *)((long)p + 0x4c8);
            uVar13 = *(uint *)((long)p + 0x4d0);
            do {
              uVar28 = uVar28 - 1;
              if (uVar28 == 0) {
                uVar28 = 0;
LAB_0011aa6c:
                *(undefined4 *)((long)p + 0x510) = uVar41;
                *(uint *)((long)p + 0x514) = uStack_9c;
                *(ulong *)((long)p + 0x4c8) = uVar36;
                *(uint *)((long)p + 0x4d0) = uVar13;
                *(byte **)((long)p + 0x498) = pbVar44;
                goto LAB_0011aaa2;
              }
LAB_0011a8fd:
              uVar21 = uVar36 << 8;
              uVar14 = uVar13 - 8;
              if ((int)uVar13 < 8) goto LAB_0011aa6c;
              uVar30 = (int)uStack_80 + 1;
              pbVar7[uStack_80] = (byte)(uVar36 >> 0x38);
              uStack_80 = (ulong)uVar30;
              uVar36 = uVar21;
              uVar13 = uVar14;
            } while (uVar30 <= uVar32);
            *(undefined4 *)((long)p + 0x510) = uVar41;
            *(uint *)((long)p + 0x514) = uStack_9c;
            *(ulong *)((long)p + 0x4c8) = uVar21;
            *(uint *)((long)p + 0x4d0) = uVar14;
            *(byte **)((long)p + 0x498) = pbVar44;
            *(uint *)((long)p + 0x4f90) = uVar28;
            *(int *)((long)p + 0x4f2c) = iStack_84;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iVar33;
            *(int *)((long)p + 0x4f38) = iVar17;
            *(uint *)((long)p + 0x4f3c) = uVar42;
            *(uint *)((long)p + 0x4f44) = uStack_a4;
            *(uint *)((long)p + 0x4f48) = uStack_a8;
            *(uint *)((long)p + 0x4f18) = uVar30;
            *(undefined8 *)((long)p + 0x4f50) = *(undefined8 *)((long)p + 0x540);
            *(long *)((long)p + 0x4f58) = lVar25;
          } while( true );
        }
      }
    }
    else if (iVar40 < 0x1c9) {
      switch(iVar40) {
      case 0x18d:
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar39 = *(undefined4 *)((long)p + 0x4f2c);
          iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
          uVar29 = *(undefined4 *)((long)p + 0x4f34);
          uVar41 = *(undefined4 *)((long)p + 0x4f38);
          uVar43 = *(undefined4 *)((long)p + 0x4f3c);
          uStack_a4 = *(undefined4 *)((long)p + 0x4f44);
          uStack_a8 = *(undefined4 *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar21 = *(ulong *)((long)p + 0x4c8);
          iVar27 = *(int *)((long)p + 0x4d0);
          do {
            uVar36 = 0;
            iVar40 = iVar27;
            if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011ac1b;
            while( true ) {
              iVar27 = iVar40 + 8;
              uVar21 = uVar21 | uVar36 << (0x38U - (char)iVar40 & 0x3f);
              if (7 < iVar27) {
                uVar36 = uVar21 << 8;
                uVar28 = (uint)(uVar21 >> 0x20) & 0xff000000;
                goto LAB_0011acea;
              }
              if (uStack_60 == *(uint **)((long)p + 0x4a0)) break;
LAB_0011ac1b:
              uVar36 = (ulong)(byte)*uStack_60;
              uStack_60 = (uint *)((long)uStack_60 + 1);
              iVar40 = iVar27;
            }
          } while (*(char *)((long)p + 0x4b0) != '\0');
          *(undefined4 *)((long)p + 0x510) = *(undefined4 *)((long)p + 0x510);
          *(uint *)((long)p + 0x514) = uStack_9c;
          *(ulong *)((long)p + 0x4c8) = uVar21;
          *(int *)((long)p + 0x4d0) = iVar27;
          *(uint **)((long)p + 0x498) = uStack_60;
          *(undefined4 *)((long)p + 0x4f2c) = uVar39;
          *(int *)((long)p + 0x4f30) = iStack_a0;
          *(undefined4 *)((long)p + 0x4f34) = uVar29;
          *(undefined4 *)((long)p + 0x4f38) = uVar41;
          *(undefined4 *)((long)p + 0x4f3c) = uVar43;
          *(uint *)((long)p + 0x4f44) = uStack_a4;
          *(uint *)((long)p + 0x4f48) = uStack_a8;
          *(uint *)((long)p + 0x4f18) = *(uint *)((long)p + 0x4f18);
        }
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x18d;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      case 0x18e:
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar39 = *(undefined4 *)((long)p + 0x4f2c);
          iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
          uVar29 = *(undefined4 *)((long)p + 0x4f34);
          uVar41 = *(undefined4 *)((long)p + 0x4f38);
          uVar43 = *(undefined4 *)((long)p + 0x4f3c);
          uStack_a4 = *(undefined4 *)((long)p + 0x4f44);
          uStack_a8 = *(undefined4 *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar36 = *(ulong *)((long)p + 0x4c8);
          iVar40 = *(int *)((long)p + 0x4d0);
          goto LAB_00119656;
        }
LAB_00118a3a:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x18e;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      case 399:
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar39 = *(undefined4 *)((long)p + 0x4f2c);
          iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
          uVar29 = *(undefined4 *)((long)p + 0x4f34);
          uVar41 = *(undefined4 *)((long)p + 0x4f38);
          uVar43 = *(undefined4 *)((long)p + 0x4f3c);
          uStack_a4 = *(undefined4 *)((long)p + 0x4f44);
          uStack_a8 = *(undefined4 *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar21 = *(ulong *)((long)p + 0x4c8);
          iVar40 = *(int *)((long)p + 0x4d0);
          goto LAB_00118e2d;
        }
LAB_001180ab:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 399;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      case 400:
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar39 = *(undefined4 *)((long)p + 0x4f2c);
          iStack_a0 = *(undefined4 *)((long)p + 0x4f30);
          uVar29 = *(undefined4 *)((long)p + 0x4f34);
          uVar41 = *(undefined4 *)((long)p + 0x4f38);
          uVar43 = *(undefined4 *)((long)p + 0x4f3c);
          uStack_a4 = *(undefined4 *)((long)p + 0x4f44);
          uStack_a8 = *(undefined4 *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar36 = *(ulong *)((long)p + 0x4c8);
          iVar40 = *(int *)((long)p + 0x4d0);
          goto LAB_001192ed;
        }
LAB_001183d7:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 400;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      default:
        if (iVar40 == 0x17c) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
          *(long *)((long)p + 0x4f50) = *(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60);
          *(long *)((long)p + 0x4f58) = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
          goto LAB_00119b7c;
        }
      }
    }
    else if (iVar40 < 0x1e6) {
      if (iVar40 == 0x1c9) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          iVar27 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar40 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uVar13 = *(uint *)((long)p + 0x4f44);
          uStack_a4 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar36 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          goto LAB_001194a7;
        }
LAB_00118609:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x1c9;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x1dd) {
        *(undefined4 *)p = 0x1dd;
        return LZHAM_DECOMP_STATUS_FAILED_DEST_BUF_TOO_SMALL;
      }
    }
    else {
      if (iVar40 == 0x1e6) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          iVar27 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar40 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uVar13 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar24 = prVar47->m_pDecode_tables;
          goto LAB_0011b56c;
        }
LAB_0011b687:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x1e6;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x206) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar30 = *(uint *)((long)p + 0x4f6c);
          iVar27 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar40 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uStack_8c = *(uint *)((long)p + 0x4f3c);
          uVar13 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar24 = prVar47->m_pDecode_tables;
          goto LAB_0011b71b;
        }
LAB_0011b857:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x206;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x21c) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        *(long *)((long)p + 0x4f50) = *(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60);
        *(long *)((long)p + 0x4f58) = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        goto LAB_001179ba;
      }
    }
    goto switchD_00117a53_caseD_338;
  }
  if (iVar40 < 0x29c) {
    if (iVar40 < 0x243) {
      if (iVar40 < 0x231) {
        if (iVar40 == 0x22b) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
            uVar31 = *(uint *)((long)p + 0x4f70);
            iVar27 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uVar42 = *(uint *)((long)p + 0x4f3c);
            uVar13 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar48 = *(uint *)((long)p + 0x510);
            uVar20 = *(uint *)((long)p + 0x514);
            uStack_60 = *(uint **)((long)p + 0x498);
            uVar36 = *(ulong *)((long)p + 0x4c8);
            uVar14 = *(uint *)((long)p + 0x4d0);
            goto LAB_00119380;
          }
LAB_001184f6:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x22b;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x22e) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
            uVar31 = *(uint *)((long)p + 0x4f70);
            iVar27 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uVar42 = *(uint *)((long)p + 0x4f3c);
            uVar13 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar30 = *(uint *)((long)p + 0x510);
            uVar20 = *(uint *)((long)p + 0x514);
            uStack_60 = *(uint **)((long)p + 0x498);
            uVar36 = *(ulong *)((long)p + 0x4c8);
            uVar14 = *(uint *)((long)p + 0x4d0);
            goto LAB_00118f4d;
          }
LAB_00117ca4:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x22e;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
      else {
        if (iVar40 == 0x231) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
            uVar31 = *(uint *)((long)p + 0x4f70);
            iVar27 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uVar42 = *(uint *)((long)p + 0x4f3c);
            uVar13 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar48 = *(uint *)((long)p + 0x510);
            uVar20 = *(uint *)((long)p + 0x514);
            uStack_60 = *(uint **)((long)p + 0x498);
            uVar36 = *(ulong *)((long)p + 0x4c8);
            uVar14 = *(uint *)((long)p + 0x4d0);
            goto LAB_00119108;
          }
LAB_001181ad:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x231;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x238) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
            uVar31 = *(uint *)((long)p + 0x4f70);
            iVar27 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uVar42 = *(uint *)((long)p + 0x4f3c);
            uVar13 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar48 = *(uint *)((long)p + 0x510);
            uStack_9c = *(uint *)((long)p + 0x514);
            uStack_60 = *(uint **)((long)p + 0x498);
            uStack_58 = *(ulong *)((long)p + 0x4c8);
            uVar14 = *(uint *)((long)p + 0x4d0);
            prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar24 = prVar47->m_pDecode_tables;
            goto LAB_0011bf5c;
          }
LAB_0011c008:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x238;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
        if (iVar40 == 0x240) {
          lVar26 = *(long *)((long)p + 0x550);
          lVar8 = **(long **)((long)p + 0x558);
          *(long *)((long)p + 0x490) = lVar26;
          *(long *)((long)p + 0x498) = lVar26;
          *(long *)((long)p + 0x4a8) = lVar8;
          *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
          *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
          if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
            uVar31 = *(uint *)((long)p + 0x4f70);
            iVar27 = *(int *)((long)p + 0x4f2c);
            iStack_a0 = *(int *)((long)p + 0x4f30);
            iVar33 = *(int *)((long)p + 0x4f34);
            iVar17 = *(int *)((long)p + 0x4f38);
            uStack_8c = *(uint *)((long)p + 0x4f3c);
            uVar13 = *(uint *)((long)p + 0x4f44);
            uStack_a8 = *(uint *)((long)p + 0x4f48);
            uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
            uVar30 = *(uint *)((long)p + 0x510);
            uStack_9c = *(uint *)((long)p + 0x514);
            uStack_60 = *(uint **)((long)p + 0x498);
            uStack_58 = *(ulong *)((long)p + 0x4c8);
            uVar14 = *(uint *)((long)p + 0x4d0);
            prStack_68 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
            pdVar24 = prStack_68->m_pDecode_tables;
            goto LAB_00119889;
          }
LAB_00119944:
          **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
          **(undefined8 **)((long)p + 0x568) = 0;
          *(undefined4 *)p = 0x240;
          return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
        }
      }
    }
    else if (iVar40 < 0x266) {
      if (iVar40 == 0x243) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar31 = *(uint *)((long)p + 0x4f70);
          iVar27 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uStack_8c = *(uint *)((long)p + 0x4f3c);
          uVar13 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar30 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar36 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          goto LAB_00119413;
        }
LAB_00118588:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x243;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x24c) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar31 = *(uint *)((long)p + 0x4f70);
          iVar27 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uStack_8c = *(uint *)((long)p + 0x4f3c);
          uVar13 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar30 = *(uint *)((long)p + 0x510);
          uVar42 = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uVar36 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          goto LAB_00118fdc;
        }
LAB_00117dac:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x24c;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else {
      if (iVar40 == 0x266) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar31 = *(uint *)((long)p + 0x4f70);
          iStack_84 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uVar13 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar48 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar24 = prVar47->m_pDecode_tables;
          goto LAB_0011c150;
        }
LAB_0011c28b:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x266;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x285) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          iVar40 = *(int *)((long)p + 0x4f70);
          uStack_8c = *(uint *)((long)p + 0x4f74);
          iStack_84 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uStack_a4 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar24 = prVar47->m_pDecode_tables;
          goto LAB_0011c435;
        }
LAB_0011c581:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x285;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x295) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar31 = *(uint *)((long)p + 0x4f70);
          uStack_8c = *(uint *)((long)p + 0x4f74);
          uVar13 = *(uint *)((long)p + 0x4f7c);
          iStack_84 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uStack_a4 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          goto LAB_00119249;
        }
LAB_00117909:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x295;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    goto switchD_00117a53_caseD_338;
  }
  if (iVar40 < 0x325) {
    if (iVar40 < 0x2c2) {
      if (iVar40 == 0x29c) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar31 = *(uint *)((long)p + 0x4f70);
          uStack_8c = *(uint *)((long)p + 0x4f74);
          uVar13 = *(uint *)((long)p + 0x4f7c);
          iStack_84 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uStack_a4 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          goto LAB_00118d83;
        }
LAB_00117fb6:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x29c;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
      if (iVar40 == 0x2a5) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
        if ((*(char *)((long)p + 0x570) != '\0') || (lVar8 != 0)) {
          uVar31 = *(uint *)((long)p + 0x4f70);
          uStack_8c = *(uint *)((long)p + 0x4f74);
          iVar27 = *(int *)((long)p + 0x4f78);
          iStack_84 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar33 = *(int *)((long)p + 0x4f34);
          iVar17 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uStack_a4 = *(uint *)((long)p + 0x4f44);
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          prVar47 = *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520);
          pdVar24 = prVar47->m_pDecode_tables;
          goto LAB_00119a65;
        }
LAB_00119b38:
        **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
        **(undefined8 **)((long)p + 0x568) = 0;
        *(undefined4 *)p = 0x2a5;
        return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
      }
    }
    else {
      if (iVar40 == 0x2c2) {
        *(undefined4 *)p = 0x2c2;
        return LZHAM_DECOMP_STATUS_FAILED_BAD_CODE;
      }
      if (iVar40 == 0x2df) {
        lVar26 = *(long *)((long)p + 0x550);
        lVar8 = **(long **)((long)p + 0x558);
        *(long *)((long)p + 0x490) = lVar26;
        *(long *)((long)p + 0x498) = lVar26;
        *(long *)((long)p + 0x4a8) = lVar8;
        *(long *)((long)p + 0x4a0) = lVar26 + lVar8;
        *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
        *(long *)((long)p + 0x4f50) = *(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60);
        *(long *)((long)p + 0x4f58) = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
        do {
          uVar36 = *(ulong *)((long)p + 0x4f58);
          if (uVar36 != 0) {
            uVar21 = **(ulong **)((long)p + 0x568);
            if (uVar36 < **(ulong **)((long)p + 0x568)) {
              uVar21 = uVar36;
            }
            *(ulong *)((long)p + 0x4f60) = uVar21;
            if (*(int *)((long)p + 0x594) == 0) {
              memcpy(*(void **)((long)p + 0x560),*(void **)((long)p + 0x4f50),uVar21);
            }
            else {
              uVar36 = *(ulong *)((long)p + 0x4f60);
              if (uVar36 != 0) {
                uVar21 = 0;
                do {
                  sVar46 = uVar36 - uVar21;
                  if (0x1fff < sVar46) {
                    sVar46 = 0x2000;
                  }
                  memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                         (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                  uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                   *(uint *)((long)p + 0x548));
                  *(uint *)((long)p + 0x548) = uVar15;
                  uVar21 = uVar21 + sVar46;
                  uVar36 = *(ulong *)((long)p + 0x4f60);
                } while (uVar21 < uVar36);
              }
            }
            **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
            **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
            *(undefined4 *)p = 0x2df;
            return LZHAM_DECOMP_STATUS_NOT_FINISHED;
          }
          uVar31 = *(uint *)((long)p + 0x4f70);
          uVar36 = (ulong)*(uint *)((long)p + 0x4f80);
          pbVar44 = *(byte **)((long)p + 0x4f88);
          iVar27 = *(int *)((long)p + 0x4f2c);
          iStack_a0 = *(int *)((long)p + 0x4f30);
          iVar40 = *(int *)((long)p + 0x4f34);
          iVar33 = *(int *)((long)p + 0x4f38);
          uVar42 = *(uint *)((long)p + 0x4f3c);
          uVar30 = *(uint *)((long)p + 0x4f44);
          uVar28 = *(uint *)((long)p + 0x510);
          uStack_9c = *(uint *)((long)p + 0x514);
          uStack_60 = *(uint **)((long)p + 0x498);
          uStack_58 = *(ulong *)((long)p + 0x4c8);
          uVar14 = *(uint *)((long)p + 0x4d0);
          uVar48 = 0;
          uStack_a8 = *(uint *)((long)p + 0x4f48);
          do {
            uStack_80 = (ulong)uVar48;
            uVar31 = uVar31 - 1;
            uVar13 = uVar30;
            while (uStack_a4 = uStack_a8, uVar31 == 0) {
LAB_0011b008:
              puVar18 = (ushort *)((long)p + (ulong)(uVar42 * 0x40 + (uVar13 >> 2)) * 2 + 0x48a0);
              iVar17 = iVar33;
              for (; uStack_9c < 0x1000000; uStack_9c = uStack_9c << 8) {
                *(ushort **)((long)p + 0x528) = puVar18;
                uVar36 = uStack_58;
                for (; (int)uVar14 < 8; uVar14 = uVar14 + 8) {
                  if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(uint *)((long)p + 0x510) = uVar28;
                      *(uint *)((long)p + 0x514) = uStack_9c;
                      *(ulong *)((long)p + 0x4c8) = uVar36;
                      *(uint *)((long)p + 0x4d0) = uVar14;
                      *(uint **)((long)p + 0x498) = uStack_60;
                      *(int *)((long)p + 0x4f2c) = iVar27;
                      *(int *)((long)p + 0x4f30) = iStack_a0;
                      *(int *)((long)p + 0x4f34) = iVar40;
                      *(int *)((long)p + 0x4f38) = iVar17;
                      *(uint *)((long)p + 0x4f3c) = uVar42;
                      *(uint *)((long)p + 0x4f44) = uVar13;
                      *(uint *)((long)p + 0x4f48) = uStack_a4;
                      *(int *)((long)p + 0x4f18) = (int)uStack_80;
                      goto LAB_00118609;
                    }
LAB_001194a7:
                    uVar21 = 0;
                    if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011b492;
                  }
                  else {
LAB_0011b492:
                    uVar21 = (ulong)(byte)*uStack_60;
                    uStack_60 = (uint *)((long)uStack_60 + 1);
                  }
                  uVar36 = uVar36 | uVar21 << (0x38U - (char)uVar14 & 0x3f);
                }
                uStack_58 = uVar36 << 8;
                uVar14 = uVar14 - 8;
                puVar18 = *(ushort **)((long)p + 0x528);
                uVar28 = uVar28 << 8 | (uint)(byte)(uVar36 >> 0x38);
              }
              uVar4 = *puVar18;
              uVar20 = (uStack_9c >> 0xb) * (uint)uVar4;
              uVar48 = uVar28 - uVar20;
              uStack_a8 = uStack_a4;
              if (uVar28 < uVar20) {
                *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
                uStack_9c = uVar20;
                if (uVar42 < 7) {
                  uVar30 = uStack_a4 >> 2 & 0xfffffff8 | uVar13 >> 5;
                  prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                            ((long)p + (ulong)uVar30 * 0x80 + 0x5a0);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)uVar30 * 0x80 + 0x5d0);
                  if ((int)uVar14 < 0x18) {
                    if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                      uVar30 = *uStack_60;
                      uVar14 = uVar14 + 0x20;
                      uStack_58 = uStack_58 |
                                  (ulong)(uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                          (uVar30 & 0xff00) << 8 | uVar30 << 0x18) <<
                                  (-(char)uVar14 & 0x3fU);
                      uStack_60 = uStack_60 + 1;
                    }
                    else {
                      for (; (int)uVar14 < 0x18; uVar14 = uVar14 + 8) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                          *(uint *)((long)p + 0x510) = uVar28;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(int *)((long)p + 0x4f2c) = iVar27;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar40;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uVar42;
                          *(uint *)((long)p + 0x4f44) = uVar13;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_0011b687;
                        }
LAB_0011b56c:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                          uVar36 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                      }
                    }
                  }
                  uStack_a4 = uVar13;
                  uVar13 = (uint)(ushort)(uStack_58 >> 0x30);
                  if (uVar13 < pdVar24->m_table_max_code) {
                    uVar13 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             & 0xffff;
                    uVar30 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             >> 0x10;
                  }
                  else {
                    iVar33 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar16 = iVar33;
                      iVar33 = iVar16 + 1;
                    } while (pdVar24->m_max_codes[iVar16 + 0x40U] <= uVar13);
                    uVar30 = (int)(uStack_58 >> (-(char)(iVar16 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar16 + 0x40U];
                    uVar13 = 0;
                    if (uVar30 < prVar47->m_total_syms) {
                      uVar13 = uVar30;
                    }
                    uVar13 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar13];
                    uVar30 = iVar16 + 0x41;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar30 & 0x3f);
                  puVar2 = (prVar47->m_sym_freq).m_p + uVar13;
                  *puVar2 = *puVar2 + 1;
                  uVar14 = uVar14 - uVar30;
                  puVar1 = &prVar47->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  uStack_8c = uVar42;
                  iVar33 = iVar17;
                  if (*puVar1 == 0) {
                    raw_quasi_adaptive_huffman_data_model::update(prVar47);
                  }
                }
                else {
                  uVar31 = (int)uStack_80 - iVar27;
                  uVar30 = (uint)pbVar7[uVar31 & uVar32];
                  uVar31 = (pbVar7[uVar31 - 1 & uVar32] >> 2 & 0x38 |
                           (uint)(pbVar7[uVar31 & uVar32] >> 5)) << 7;
                  prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                            ((long)p + (ulong)uVar31 + 0x25a0);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)uVar31 + 0x25d0);
                  uStack_8c = uVar42;
                  if ((int)uVar14 < 0x18) {
                    if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                      uVar42 = *uStack_60;
                      uVar14 = uVar14 + 0x20;
                      uStack_58 = uStack_58 |
                                  (ulong)(uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 |
                                          (uVar42 & 0xff00) << 8 | uVar42 << 0x18) <<
                                  (-(char)uVar14 & 0x3fU);
                      uStack_60 = uStack_60 + 1;
                    }
                    else {
                      for (; (int)uVar14 < 0x18; uVar14 = uVar14 + 8) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                          *(uint *)((long)p + 0x510) = uVar28;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f6c) = uVar30;
                          *(int *)((long)p + 0x4f2c) = iVar27;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar40;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uStack_8c;
                          *(uint *)((long)p + 0x4f44) = uVar13;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_0011b857;
                        }
LAB_0011b71b:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                          uVar36 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                      }
                    }
                  }
                  uStack_a4 = uVar13;
                  uVar13 = (uint)(ushort)(uStack_58 >> 0x30);
                  if (uVar13 < pdVar24->m_table_max_code) {
                    uVar13 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             & 0xffff;
                    uVar42 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             >> 0x10;
                  }
                  else {
                    iVar33 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar16 = iVar33;
                      iVar33 = iVar16 + 1;
                    } while (pdVar24->m_max_codes[iVar16 + 0x40U] <= uVar13);
                    uVar42 = (int)(uStack_58 >> (-(char)(iVar16 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar16 + 0x40U];
                    uVar13 = 0;
                    if (uVar42 < prVar47->m_total_syms) {
                      uVar13 = uVar42;
                    }
                    uVar13 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar13];
                    uVar42 = iVar16 + 0x41;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar42 & 0x3f);
                  puVar2 = (prVar47->m_sym_freq).m_p + uVar13;
                  *puVar2 = *puVar2 + 1;
                  uVar14 = uVar14 - uVar42;
                  puVar1 = &prVar47->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    raw_quasi_adaptive_huffman_data_model::update(prVar47);
                  }
                  uVar13 = uVar13 ^ uVar30;
                  iVar33 = iVar17;
                }
                pbVar7[uStack_80] = (byte)uVar13;
                uVar42 = (uint)(byte)s_literal_next_state[uStack_8c];
                uVar30 = (int)uStack_80 + 1;
                uStack_80 = (ulong)uVar30;
                if (uVar32 < uVar30) {
                  *(uint *)((long)p + 0x510) = uVar28;
                  *(uint *)((long)p + 0x514) = uStack_9c;
                  *(ulong *)((long)p + 0x4c8) = uStack_58;
                  *(uint *)((long)p + 0x4d0) = uVar14;
                  *(uint **)((long)p + 0x498) = uStack_60;
                  *(int *)((long)p + 0x4f2c) = iVar27;
                  *(int *)((long)p + 0x4f30) = iStack_a0;
                  *(int *)((long)p + 0x4f34) = iVar40;
                  *(int *)((long)p + 0x4f38) = iVar33;
                  *(uint *)((long)p + 0x4f3c) = uVar42;
                  *(uint *)((long)p + 0x4f44) = uVar13;
                  *(uint *)((long)p + 0x4f48) = uStack_a4;
                  *(uint *)((long)p + 0x4f18) = uVar30;
                  *(undefined8 *)((long)p + 0x4f50) = *(undefined8 *)((long)p + 0x540);
                  *(long *)((long)p + 0x4f58) = lVar25;
LAB_001179ba:
                  uVar36 = *(ulong *)((long)p + 0x4f58);
                  if (uVar36 != 0) {
                    uVar21 = **(ulong **)((long)p + 0x568);
                    if (uVar36 < **(ulong **)((long)p + 0x568)) {
                      uVar21 = uVar36;
                    }
                    *(ulong *)((long)p + 0x4f60) = uVar21;
                    if (*(int *)((long)p + 0x594) == 0) {
                      memcpy(*(void **)((long)p + 0x560),*(void **)((long)p + 0x4f50),uVar21);
                    }
                    else {
                      uVar36 = *(ulong *)((long)p + 0x4f60);
                      if (uVar36 != 0) {
                        uVar21 = 0;
                        do {
                          sVar46 = uVar36 - uVar21;
                          if (0x1fff < sVar46) {
                            sVar46 = 0x2000;
                          }
                          memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                                 (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
                          uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                                           *(uint *)((long)p + 0x548));
                          *(uint *)((long)p + 0x548) = uVar15;
                          uVar21 = uVar21 + sVar46;
                          uVar36 = *(ulong *)((long)p + 0x4f60);
                        } while (uVar21 < uVar36);
                      }
                    }
                    **(long **)((long)p + 0x558) =
                         *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
                    **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
                    *(undefined4 *)p = 0x21c;
                    return LZHAM_DECOMP_STATUS_NOT_FINISHED;
                  }
                  iVar27 = *(int *)((long)p + 0x4f2c);
                  iStack_a0 = *(int *)((long)p + 0x4f30);
                  iVar40 = *(int *)((long)p + 0x4f34);
                  iVar33 = *(int *)((long)p + 0x4f38);
                  uVar28 = *(uint *)((long)p + 0x510);
                  uStack_9c = *(uint *)((long)p + 0x514);
                  uStack_60 = *(uint **)((long)p + 0x498);
                  uStack_58 = *(ulong *)((long)p + 0x4c8);
                  uVar14 = *(uint *)((long)p + 0x4d0);
                  uStack_80 = 0;
                  uVar13 = *(uint *)((long)p + 0x4f44);
                  uVar42 = *(uint *)((long)p + 0x4f3c);
                  uStack_a4 = *(uint *)((long)p + 0x4f48);
                }
                goto LAB_0011b008;
              }
              *puVar18 = uVar4 - (uVar4 >> 5);
              puVar18 = (ushort *)((long)p + (ulong)uVar42 * 2 + 0x4ea0);
              uVar31 = 1;
              iVar33 = iVar40;
              for (uVar20 = uStack_9c - uVar20; uVar20 < 0x1000000; uVar20 = uVar20 << 8) {
                *(ushort **)((long)p + 0x528) = puVar18;
                uVar36 = uStack_58;
                for (; (int)uVar14 < 8; uVar14 = uVar14 + 8) {
                  if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                    if (*(char *)((long)p + 0x4b0) == '\0') {
                      *(uint *)((long)p + 0x510) = uVar48;
                      *(uint *)((long)p + 0x514) = uVar20;
                      *(ulong *)((long)p + 0x4c8) = uVar36;
                      *(uint *)((long)p + 0x4d0) = uVar14;
                      *(uint **)((long)p + 0x498) = uStack_60;
                      *(uint *)((long)p + 0x4f70) = uVar31;
                      *(int *)((long)p + 0x4f2c) = iVar27;
                      *(int *)((long)p + 0x4f30) = iStack_a0;
                      *(int *)((long)p + 0x4f34) = iVar33;
                      *(int *)((long)p + 0x4f38) = iVar17;
                      *(uint *)((long)p + 0x4f3c) = uVar42;
                      *(uint *)((long)p + 0x4f44) = uVar13;
                      *(uint *)((long)p + 0x4f48) = uStack_a8;
                      *(int *)((long)p + 0x4f18) = (int)uStack_80;
                      goto LAB_001184f6;
                    }
LAB_00119380:
                    uVar21 = 0;
                    if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011badf;
                  }
                  else {
LAB_0011badf:
                    uVar21 = (ulong)(byte)*uStack_60;
                    uStack_60 = (uint *)((long)uStack_60 + 1);
                  }
                  uVar36 = uVar36 | uVar21 << (0x38U - (char)uVar14 & 0x3f);
                }
                uStack_58 = uVar36 << 8;
                uVar14 = uVar14 - 8;
                puVar18 = *(ushort **)((long)p + 0x528);
                uVar48 = uVar48 << 8 | (uint)(byte)(uVar36 >> 0x38);
              }
              uVar4 = *puVar18;
              uStack_9c = (uVar20 >> 0xb) * (uint)uVar4;
              uVar30 = uVar48 - uStack_9c;
              if (uVar48 < uStack_9c) {
                *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
                prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0);
                pdVar24 = *(decoder_tables **)((long)p + 0x45d0);
                uStack_a4 = uVar13;
                iStack_84 = iVar27;
                uVar28 = uVar48;
                if ((int)uVar14 < 0x18) {
                  if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                    uVar13 = *uStack_60;
                    uVar14 = uVar14 + 0x20;
                    uStack_58 = uStack_58 |
                                (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                        (uVar13 & 0xff00) << 8 | uVar13 << 0x18) <<
                                (-(char)uVar14 & 0x3fU);
                    uStack_60 = uStack_60 + 1;
                  }
                  else {
                    for (; uStack_a4 = uVar13, uVar28 = uVar48, (int)uVar14 < 0x18;
                        uVar14 = uVar14 + 8) {
                      if (*(char *)((long)p + 0x4b0) == '\0') {
                        *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                        *(uint *)((long)p + 0x510) = uVar48;
                        *(uint *)((long)p + 0x514) = uStack_9c;
                        *(ulong *)((long)p + 0x4c8) = uStack_58;
                        *(uint *)((long)p + 0x4d0) = uVar14;
                        *(uint **)((long)p + 0x498) = uStack_60;
                        *(uint *)((long)p + 0x4f70) = uVar31;
                        *(int *)((long)p + 0x4f2c) = iStack_84;
                        *(int *)((long)p + 0x4f30) = iStack_a0;
                        *(int *)((long)p + 0x4f34) = iVar33;
                        *(int *)((long)p + 0x4f38) = iVar17;
                        *(uint *)((long)p + 0x4f3c) = uVar42;
                        *(uint *)((long)p + 0x4f44) = uVar13;
                        *(uint *)((long)p + 0x4f48) = uStack_a8;
                        *(int *)((long)p + 0x4f18) = (int)uStack_80;
                        goto LAB_0011c28b;
                      }
LAB_0011c150:
                      uVar36 = 0;
                      if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                        uVar36 = (ulong)(byte)*uStack_60;
                        uStack_60 = (uint *)((long)uStack_60 + 1);
                      }
                      uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                    }
                  }
                }
                uVar13 = (uint)(ushort)(uStack_58 >> 0x30);
                if (uVar13 < pdVar24->m_table_max_code) {
                  uVar13 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)] &
                           0xffff;
                  uVar30 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >>
                           0x10;
                }
                else {
                  iVar40 = pdVar24->m_decode_start_code_size - 0x41;
                  do {
                    iVar27 = iVar40;
                    iVar40 = iVar27 + 1;
                  } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar13);
                  uVar30 = (int)(uStack_58 >> (-(char)(iVar27 + 1) & 0x3fU)) +
                           pdVar24->m_val_ptrs[iVar27 + 0x40U];
                  uVar13 = 0;
                  if (uVar30 < prVar47->m_total_syms) {
                    uVar13 = uVar30;
                  }
                  uVar30 = iVar27 + 0x41;
                  uVar13 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar13];
                }
                uStack_58 = uStack_58 << ((byte)uVar30 & 0x3f);
                puVar2 = (prVar47->m_sym_freq).m_p + uVar13;
                *puVar2 = *puVar2 + 1;
                uVar14 = uVar14 - uVar30;
                puVar1 = &prVar47->m_symbols_until_update;
                *puVar1 = *puVar1 - 1;
                if (*puVar1 == 0) {
                  raw_quasi_adaptive_huffman_data_model::update(prVar47);
                }
                if (uVar13 < 2) {
                  if (uVar13 == 0) {
                    if ((uVar14 & 7) != 0) goto LAB_0011c9ef;
                    goto LAB_0011ca05;
                  }
                  iVar33 = 1;
                  iVar40 = 1;
                  iStack_a0 = 1;
                  iVar27 = 1;
                  uVar13 = uStack_a4;
                  uVar42 = 0;
                  uStack_a4 = uStack_a8;
                  goto LAB_0011b008;
                }
                uVar31 = (uVar13 - 2 & 7) + 2;
                uStack_8c = (uVar13 - 2 >> 3) + 1;
                if (uVar31 == 9) {
                  prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                            ((long)p + (ulong)(6 < uVar42) * 0x80 + 0x4720);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar42) * 0x80 + 0x4750);
                  iVar40 = 9;
                  if ((int)uVar14 < 0x18) {
                    if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                      uVar13 = *uStack_60;
                      uVar14 = uVar14 + 0x20;
                      uStack_58 = uStack_58 |
                                  (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                          (uVar13 & 0xff00) << 8 | uVar13 << 0x18) <<
                                  (-(char)uVar14 & 0x3fU);
                      iVar40 = 9;
                      uStack_60 = uStack_60 + 1;
                    }
                    else {
                      iVar40 = 9;
                      for (; (int)uVar14 < 0x18; uVar14 = uVar14 + 8) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                          *(uint *)((long)p + 0x510) = uVar28;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(int *)((long)p + 0x4f70) = iVar40;
                          *(uint *)((long)p + 0x4f74) = uStack_8c;
                          *(int *)((long)p + 0x4f2c) = iStack_84;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uVar42;
                          *(uint *)((long)p + 0x4f44) = uStack_a4;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_0011c581;
                        }
LAB_0011c435:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                          uVar36 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                      }
                    }
                  }
                  uVar13 = (uint)(ushort)(uStack_58 >> 0x30);
                  if (uVar13 < pdVar24->m_table_max_code) {
                    uVar31 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             & 0xffff;
                    uVar13 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             >> 0x10;
                  }
                  else {
                    iVar27 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar16 = iVar27;
                      iVar27 = iVar16 + 1;
                    } while (pdVar24->m_max_codes[iVar16 + 0x40U] <= uVar13);
                    uVar30 = (int)(uStack_58 >> (-(char)(iVar16 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar16 + 0x40U];
                    uVar13 = 0;
                    if (uVar30 < prVar47->m_total_syms) {
                      uVar13 = uVar30;
                    }
                    uVar31 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar13];
                    uVar13 = iVar16 + 0x41;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar13 & 0x3f);
                  puVar2 = (prVar47->m_sym_freq).m_p + uVar31;
                  *puVar2 = *puVar2 + 1;
                  uVar14 = uVar14 - uVar13;
                  puVar1 = &prVar47->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    raw_quasi_adaptive_huffman_data_model::update(prVar47);
                  }
                  uVar31 = uVar31 + iVar40;
                }
                bVar37 = *(byte *)((long)p + (ulong)uStack_8c + 0x410);
                uVar13 = (uint)bVar37;
                if (uVar13 < 3) {
                  for (; uVar30 = uVar14 - uVar13, (int)uVar14 < (int)uVar13; uVar14 = uVar14 + 8) {
                    if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                      if (*(char *)((long)p + 0x4b0) == '\0') {
                        *(uint *)((long)p + 0x510) = uVar28;
                        *(uint *)((long)p + 0x514) = uStack_9c;
                        *(ulong *)((long)p + 0x4c8) = uStack_58;
                        *(uint *)((long)p + 0x4d0) = uVar14;
                        *(uint **)((long)p + 0x498) = uStack_60;
                        *(uint *)((long)p + 0x4f70) = uVar31;
                        *(uint *)((long)p + 0x4f74) = uStack_8c;
                        *(uint *)((long)p + 0x4f7c) = uVar13;
                        *(int *)((long)p + 0x4f2c) = iStack_84;
                        *(int *)((long)p + 0x4f30) = iStack_a0;
                        *(int *)((long)p + 0x4f34) = iVar33;
                        *(int *)((long)p + 0x4f38) = iVar17;
                        *(uint *)((long)p + 0x4f3c) = uVar42;
                        *(uint *)((long)p + 0x4f44) = uStack_a4;
                        *(uint *)((long)p + 0x4f48) = uStack_a8;
                        *(int *)((long)p + 0x4f18) = (int)uStack_80;
                        goto LAB_00117909;
                      }
LAB_00119249:
                      uVar36 = 0;
                      if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011a518;
                    }
                    else {
LAB_0011a518:
                      uVar36 = (ulong)(byte)*uStack_60;
                      uStack_60 = (uint *)((long)uStack_60 + 1);
                    }
                    uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                  }
                  iVar27 = (int)(uStack_58 >> (-(byte)uVar13 & 0x3f));
                  if (uVar13 == 0) {
                    iVar27 = 0;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar13 & 0x3f);
                }
                else {
                  iVar27 = 0;
                  if (4 < bVar37) {
                    while( true ) {
                      iVar40 = uVar13 - 4;
                      if (iVar40 <= (int)uVar14) break;
                      if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(uint *)((long)p + 0x510) = uVar28;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f70) = uVar31;
                          *(uint *)((long)p + 0x4f74) = uStack_8c;
                          *(uint *)((long)p + 0x4f7c) = uVar13;
                          *(int *)((long)p + 0x4f2c) = iStack_84;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uVar42;
                          *(uint *)((long)p + 0x4f44) = uStack_a4;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_00117fb6;
                        }
LAB_00118d83:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011c798;
                      }
                      else {
LAB_0011c798:
                        uVar36 = (ulong)(byte)*uStack_60;
                        uStack_60 = (uint *)((long)uStack_60 + 1);
                      }
                      cVar11 = (char)uVar14;
                      uVar14 = uVar14 + 8;
                      uStack_58 = uStack_58 | uVar36 << (0x38U - cVar11 & 0x3f);
                    }
                    iVar27 = (int)(uStack_58 >> (0x44U - (char)uVar13 & 0x3f)) << 4;
                    if (iVar40 == 0) {
                      iVar27 = 0;
                    }
                    uStack_58 = uStack_58 << ((byte)iVar40 & 0x3f);
                    uVar14 = uVar14 - iVar40;
                  }
                  prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820);
                  pdVar24 = *(decoder_tables **)((long)p + 0x4850);
                  if ((int)uVar14 < 0x18) {
                    if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                      uVar13 = *uStack_60;
                      uVar14 = uVar14 + 0x20;
                      uStack_58 = uStack_58 |
                                  (ulong)(uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 |
                                          (uVar13 & 0xff00) << 8 | uVar13 << 0x18) <<
                                  (-(char)uVar14 & 0x3fU);
                      uStack_60 = uStack_60 + 1;
                    }
                    else {
                      for (; (int)uVar14 < 0x18; uVar14 = uVar14 + 8) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                          *(uint *)((long)p + 0x510) = uVar28;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f70) = uVar31;
                          *(uint *)((long)p + 0x4f74) = uStack_8c;
                          *(int *)((long)p + 0x4f78) = iVar27;
                          *(int *)((long)p + 0x4f2c) = iStack_84;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uVar42;
                          *(uint *)((long)p + 0x4f44) = uStack_a4;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_00119b38;
                        }
LAB_00119a65:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                          uVar36 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                      }
                    }
                  }
                  uVar13 = (uint)(ushort)(uStack_58 >> 0x30);
                  if (uVar13 < pdVar24->m_table_max_code) {
                    uVar13 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             & 0xffff;
                    uVar30 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             >> 0x10;
                  }
                  else {
                    iVar40 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar17 = iVar40;
                      iVar40 = iVar17 + 1;
                    } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar13);
                    uVar30 = (int)(uStack_58 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar17 + 0x40U];
                    uVar13 = 0;
                    if (uVar30 < prVar47->m_total_syms) {
                      uVar13 = uVar30;
                    }
                    uVar13 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar13];
                    uVar30 = iVar17 + 0x41;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar30 & 0x3f);
                  puVar2 = (prVar47->m_sym_freq).m_p + uVar13;
                  *puVar2 = *puVar2 + 1;
                  uVar30 = uVar14 - uVar30;
                  puVar1 = &prVar47->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    raw_quasi_adaptive_huffman_data_model::update(prVar47);
                  }
                  iVar27 = uVar13 + iVar27;
                }
                iVar27 = iVar27 + *(int *)((long)p + (ulong)uStack_8c * 4 + 0x10);
                uVar42 = (uint)(6 < uVar42) * 3 + 7;
                iVar40 = iStack_a0;
                iStack_a0 = iStack_84;
                uVar14 = uVar30;
              }
              else {
                *puVar18 = uVar4 - (uVar4 >> 5);
                puVar18 = (ushort *)((long)p + (ulong)uVar42 * 2 + 0x4eb8);
                for (uVar20 = uVar20 - uStack_9c; uVar20 < 0x1000000; uVar20 = uVar20 << 8) {
                  *(ushort **)((long)p + 0x528) = puVar18;
                  uVar36 = uStack_58;
                  for (; (int)uVar14 < 8; uVar14 = uVar14 + 8) {
                    if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                      if (*(char *)((long)p + 0x4b0) == '\0') {
                        *(uint *)((long)p + 0x510) = uVar30;
                        *(uint *)((long)p + 0x514) = uVar20;
                        *(ulong *)((long)p + 0x4c8) = uVar36;
                        *(uint *)((long)p + 0x4d0) = uVar14;
                        *(uint **)((long)p + 0x498) = uStack_60;
                        *(uint *)((long)p + 0x4f70) = uVar31;
                        *(int *)((long)p + 0x4f2c) = iVar27;
                        *(int *)((long)p + 0x4f30) = iStack_a0;
                        *(int *)((long)p + 0x4f34) = iVar33;
                        *(int *)((long)p + 0x4f38) = iVar17;
                        *(uint *)((long)p + 0x4f3c) = uVar42;
                        *(uint *)((long)p + 0x4f44) = uVar13;
                        *(uint *)((long)p + 0x4f48) = uStack_a8;
                        *(int *)((long)p + 0x4f18) = (int)uStack_80;
                        goto LAB_00117ca4;
                      }
LAB_00118f4d:
                      uVar21 = 0;
                      if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011a262;
                    }
                    else {
LAB_0011a262:
                      uVar21 = (ulong)(byte)*uStack_60;
                      uStack_60 = (uint *)((long)uStack_60 + 1);
                    }
                    uVar36 = uVar36 | uVar21 << (0x38U - (char)uVar14 & 0x3f);
                  }
                  uStack_58 = uVar36 << 8;
                  uVar14 = uVar14 - 8;
                  puVar18 = *(ushort **)((long)p + 0x528);
                  uVar30 = uVar30 << 8 | (uint)(byte)(uVar36 >> 0x38);
                }
                uVar4 = *puVar18;
                uStack_9c = (uVar20 >> 0xb) * (uint)uVar4;
                uVar48 = uVar30 - uStack_9c;
                if (uVar30 < uStack_9c) {
                  *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
                  prStack_68 = (raw_quasi_adaptive_huffman_data_model *)
                               ((long)p + (ulong)(6 < uVar42) * 0x80 + 0x4620);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar42) * 0x80 + 18000);
                  uStack_8c = uVar42;
                  if ((int)uVar14 < 0x18) {
                    if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                      uVar42 = *uStack_60;
                      uVar14 = uVar14 + 0x20;
                      uStack_58 = uStack_58 |
                                  (ulong)(uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 |
                                          (uVar42 & 0xff00) << 8 | uVar42 << 0x18) <<
                                  (-(char)uVar14 & 0x3fU);
                      uStack_60 = uStack_60 + 1;
                    }
                    else {
                      for (; (int)uVar14 < 0x18; uVar14 = uVar14 + 8) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prStack_68;
                          *(uint *)((long)p + 0x510) = uVar30;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f70) = uVar31;
                          *(int *)((long)p + 0x4f2c) = iVar27;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uStack_8c;
                          *(uint *)((long)p + 0x4f44) = uVar13;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_00119944;
                        }
LAB_00119889:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                          uVar36 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                      }
                    }
                  }
                  uVar42 = (uint)(ushort)(uStack_58 >> 0x30);
                  if (uVar42 < pdVar24->m_table_max_code) {
                    uVar31 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             & 0xffff;
                    uVar42 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             >> 0x10;
                  }
                  else {
                    iVar40 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar16 = iVar40;
                      iVar40 = iVar16 + 1;
                    } while (pdVar24->m_max_codes[iVar16 + 0x40U] <= uVar42);
                    uVar28 = (int)(uStack_58 >> (-(char)(iVar16 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar16 + 0x40U];
                    uVar42 = 0;
                    if (uVar28 < prStack_68->m_total_syms) {
                      uVar42 = uVar28;
                    }
                    uVar31 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar42];
                    uVar42 = iVar16 + 0x41;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar42 & 0x3f);
                  puVar2 = (prStack_68->m_sym_freq).m_p + uVar31;
                  *puVar2 = *puVar2 + 1;
                  uVar14 = uVar14 - uVar42;
                  puVar1 = &prStack_68->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    raw_quasi_adaptive_huffman_data_model::update(prStack_68);
                  }
                  uVar31 = uVar31 + 2;
                  puVar18 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4ee8);
                  for (; uStack_9c < 0x1000000; uStack_9c = uStack_9c << 8) {
                    *(ushort **)((long)p + 0x528) = puVar18;
                    uVar36 = uStack_58;
                    for (; (int)uVar14 < 8; uVar14 = uVar14 + 8) {
                      if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(uint *)((long)p + 0x510) = uVar30;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uVar36;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f70) = uVar31;
                          *(int *)((long)p + 0x4f2c) = iVar27;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uStack_8c;
                          *(uint *)((long)p + 0x4f44) = uVar13;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_00118588;
                        }
LAB_00119413:
                        uVar21 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011c06d;
                      }
                      else {
LAB_0011c06d:
                        uVar21 = (ulong)(byte)*uStack_60;
                        uStack_60 = (uint *)((long)uStack_60 + 1);
                      }
                      uVar36 = uVar36 | uVar21 << (0x38U - (char)uVar14 & 0x3f);
                    }
                    uStack_58 = uVar36 << 8;
                    uVar14 = uVar14 - 8;
                    puVar18 = *(ushort **)((long)p + 0x528);
                    uVar30 = uVar30 << 8 | (uint)(byte)(uVar36 >> 0x38);
                  }
                  uVar4 = *puVar18;
                  uVar42 = (uStack_9c >> 0xb) * (uint)uVar4;
                  if (uVar30 < uVar42) {
                    *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
                    puVar18 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4f00);
                    for (; uVar42 < 0x1000000; uVar42 = uVar42 << 8) {
                      *(ushort **)((long)p + 0x528) = puVar18;
                      uVar36 = uStack_58;
                      for (; (int)uVar14 < 8; uVar14 = uVar14 + 8) {
                        if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                          if (*(char *)((long)p + 0x4b0) == '\0') {
                            *(uint *)((long)p + 0x510) = uVar30;
                            *(uint *)((long)p + 0x514) = uVar42;
                            *(ulong *)((long)p + 0x4c8) = uVar36;
                            *(uint *)((long)p + 0x4d0) = uVar14;
                            *(uint **)((long)p + 0x498) = uStack_60;
                            *(uint *)((long)p + 0x4f70) = uVar31;
                            *(int *)((long)p + 0x4f2c) = iVar27;
                            *(int *)((long)p + 0x4f30) = iStack_a0;
                            *(int *)((long)p + 0x4f34) = iVar33;
                            *(int *)((long)p + 0x4f38) = iVar17;
                            *(uint *)((long)p + 0x4f3c) = uStack_8c;
                            *(uint *)((long)p + 0x4f44) = uVar13;
                            *(uint *)((long)p + 0x4f48) = uStack_a8;
                            *(int *)((long)p + 0x4f18) = (int)uStack_80;
                            goto LAB_00117dac;
                          }
LAB_00118fdc:
                          uVar21 = 0;
                          if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011a357;
                        }
                        else {
LAB_0011a357:
                          uVar21 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uVar36 = uVar36 | uVar21 << (0x38U - (char)uVar14 & 0x3f);
                      }
                      uStack_58 = uVar36 << 8;
                      uVar14 = uVar14 - 8;
                      puVar18 = *(ushort **)((long)p + 0x528);
                      uVar30 = uVar30 << 8 | (uint)(byte)(uVar36 >> 0x38);
                    }
                    uVar4 = *puVar18;
                    uStack_9c = (uVar42 >> 0xb) * (uint)uVar4;
                    uVar28 = uVar30 - uStack_9c;
                    iVar40 = iStack_a0;
                    uStack_a4 = uVar13;
                    if (uVar30 < uStack_9c) {
                      *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
                      iVar16 = iVar17;
                      iStack_a0 = iVar27;
                      uVar28 = uVar30;
                    }
                    else {
                      *puVar18 = uVar4 - (uVar4 >> 5);
                      uStack_9c = uVar42 - uStack_9c;
                      iVar16 = iVar33;
                      iStack_a0 = iVar27;
                      iVar33 = iVar17;
                    }
                  }
                  else {
                    *puVar18 = uVar4 - (uVar4 >> 5);
                    uStack_9c = uStack_9c - uVar42;
                    iVar16 = iStack_a0;
                    iVar40 = iVar33;
                    uStack_a4 = uVar13;
                    iStack_a0 = iVar27;
                    iVar33 = iVar17;
                    uVar28 = uVar30 - uVar42;
                  }
                }
                else {
                  *puVar18 = uVar4 - (uVar4 >> 5);
                  puVar18 = (ushort *)((long)p + (ulong)uVar42 * 2 + 0x4ed0);
                  for (uVar20 = uVar20 - uStack_9c; uVar20 < 0x1000000; uVar20 = uVar20 << 8) {
                    *(ushort **)((long)p + 0x528) = puVar18;
                    uVar36 = uStack_58;
                    for (; (int)uVar14 < 8; uVar14 = uVar14 + 8) {
                      if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(uint *)((long)p + 0x510) = uVar48;
                          *(uint *)((long)p + 0x514) = uVar20;
                          *(ulong *)((long)p + 0x4c8) = uVar36;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f70) = uVar31;
                          *(int *)((long)p + 0x4f2c) = iVar27;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uVar42;
                          *(uint *)((long)p + 0x4f44) = uVar13;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_001181ad;
                        }
LAB_00119108:
                        uVar21 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011be85;
                      }
                      else {
LAB_0011be85:
                        uVar21 = (ulong)(byte)*uStack_60;
                        uStack_60 = (uint *)((long)uStack_60 + 1);
                      }
                      uVar36 = uVar36 | uVar21 << (0x38U - (char)uVar14 & 0x3f);
                    }
                    uStack_58 = uVar36 << 8;
                    uVar14 = uVar14 - 8;
                    puVar18 = *(ushort **)((long)p + 0x528);
                    uVar48 = uVar48 << 8 | (uint)(byte)(uVar36 >> 0x38);
                  }
                  uVar4 = *puVar18;
                  uStack_9c = (uVar20 >> 0xb) * (uint)uVar4;
                  uVar28 = uVar48 - uStack_9c;
                  if (uStack_9c <= uVar48) {
                    *puVar18 = uVar4 - (uVar4 >> 5);
                    uStack_9c = uVar20 - uStack_9c;
                    uVar42 = (uint)(6 < uVar42) * 2 + 9;
                    iVar40 = iVar33;
                    uStack_a4 = uVar13;
                    iVar33 = iVar17;
                    goto LAB_0011bbaf;
                  }
                  *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
                  prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                            ((long)p + (ulong)(6 < uVar42) * 0x80 + 0x4620);
                  pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar42) * 0x80 + 18000);
                  if ((int)uVar14 < 0x18) {
                    if (uStack_60 + 1 < *(uint **)((long)p + 0x4a0)) {
                      uVar28 = *uStack_60;
                      uVar14 = uVar14 + 0x20;
                      uStack_58 = uStack_58 |
                                  (ulong)(uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                          (uVar28 & 0xff00) << 8 | uVar28 << 0x18) <<
                                  (-(char)uVar14 & 0x3fU);
                      uStack_60 = uStack_60 + 1;
                    }
                    else {
                      for (; (int)uVar14 < 0x18; uVar14 = uVar14 + 8) {
                        if (*(char *)((long)p + 0x4b0) == '\0') {
                          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                          *(uint *)((long)p + 0x510) = uVar48;
                          *(uint *)((long)p + 0x514) = uStack_9c;
                          *(ulong *)((long)p + 0x4c8) = uStack_58;
                          *(uint *)((long)p + 0x4d0) = uVar14;
                          *(uint **)((long)p + 0x498) = uStack_60;
                          *(uint *)((long)p + 0x4f70) = uVar31;
                          *(int *)((long)p + 0x4f2c) = iVar27;
                          *(int *)((long)p + 0x4f30) = iStack_a0;
                          *(int *)((long)p + 0x4f34) = iVar33;
                          *(int *)((long)p + 0x4f38) = iVar17;
                          *(uint *)((long)p + 0x4f3c) = uVar42;
                          *(uint *)((long)p + 0x4f44) = uVar13;
                          *(uint *)((long)p + 0x4f48) = uStack_a8;
                          *(int *)((long)p + 0x4f18) = (int)uStack_80;
                          goto LAB_0011c008;
                        }
LAB_0011bf5c:
                        uVar36 = 0;
                        if (uStack_60 < *(uint **)((long)p + 0x4a0)) {
                          uVar36 = (ulong)(byte)*uStack_60;
                          uStack_60 = (uint *)((long)uStack_60 + 1);
                        }
                        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
                      }
                    }
                  }
                  uVar28 = (uint)(ushort)(uStack_58 >> 0x30);
                  if (uVar28 < pdVar24->m_table_max_code) {
                    uVar31 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             & 0xffff;
                    uVar28 = pdVar24->m_lookup[uStack_58 >> (-(char)pdVar24->m_table_bits & 0x3fU)]
                             >> 0x10;
                  }
                  else {
                    iVar40 = pdVar24->m_decode_start_code_size - 0x41;
                    do {
                      iVar16 = iVar40;
                      iVar40 = iVar16 + 1;
                    } while (pdVar24->m_max_codes[iVar16 + 0x40U] <= uVar28);
                    uVar30 = (int)(uStack_58 >> (-(char)(iVar16 + 1) & 0x3fU)) +
                             pdVar24->m_val_ptrs[iVar16 + 0x40U];
                    uVar28 = 0;
                    if (uVar30 < prVar47->m_total_syms) {
                      uVar28 = uVar30;
                    }
                    uVar31 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar28];
                    uVar28 = iVar16 + 0x41;
                  }
                  uStack_58 = uStack_58 << ((byte)uVar28 & 0x3f);
                  puVar2 = (prVar47->m_sym_freq).m_p + uVar31;
                  *puVar2 = *puVar2 + 1;
                  uVar14 = uVar14 - uVar28;
                  puVar1 = &prVar47->m_symbols_until_update;
                  *puVar1 = *puVar1 - 1;
                  if (*puVar1 == 0) {
                    raw_quasi_adaptive_huffman_data_model::update(prVar47);
                  }
                  uVar31 = uVar31 + 2;
                  iVar16 = iVar27;
                  iVar40 = iVar33;
                  uStack_a4 = uVar13;
                  uStack_8c = uVar42;
                  iVar33 = iVar17;
                  uVar28 = uVar48;
                }
                iVar27 = iVar16;
                uVar42 = (uint)(6 < uStack_8c) * 3 + 8;
              }
LAB_0011bbaf:
              uVar48 = (uint)uStack_80;
              uVar13 = uVar48 - iVar27 & uVar32;
              uVar36 = (ulong)uVar13;
              uVar30 = uVar48;
              if (uVar48 < uVar13) {
                uVar30 = uVar13;
              }
              pbVar44 = pbVar7 + uVar36;
              uVar13 = uStack_a4;
              if (uVar30 + uVar31 <= uVar32) {
                pbVar45 = pbVar7 + uStack_80;
                if (iVar27 == 1) {
                  bVar37 = *pbVar44;
                  uVar30 = (uint)bVar37;
                  if (uVar31 < 8) {
                    if ((uVar31 != 0) && (memset(pbVar45,(uint)bVar37,(ulong)uVar31), uVar31 == 1))
                    {
                      uVar30 = uStack_a4;
                    }
                  }
                  else {
                    memset(pbVar45,uVar30,(ulong)uVar31);
                  }
                }
                else if (uVar31 == 1) {
                  bVar37 = *pbVar44;
                  *pbVar45 = bVar37;
                  uVar30 = uStack_a4;
                }
                else {
                  uVar13 = uVar31 - 2;
                  if ((uVar13 < 8) || (iVar27 < (int)uVar13)) {
                    if (0 < (int)uVar13) {
                      iVar17 = uVar31 - 1;
                      do {
                        bVar37 = *pbVar44;
                        pbVar44 = pbVar44 + 1;
                        *pbVar45 = bVar37;
                        pbVar45 = pbVar45 + 1;
                        iVar17 = iVar17 + -1;
                      } while (1 < iVar17);
                    }
                  }
                  else {
                    uVar36 = (ulong)uVar13;
                    memcpy(pbVar45,pbVar44,uVar36);
                    pbVar45 = pbVar45 + uVar36;
                    pbVar44 = pbVar44 + uVar36;
                  }
                  bVar3 = *pbVar44;
                  *pbVar45 = bVar3;
                  bVar37 = pbVar44[1];
                  pbVar45[1] = bVar37;
                  uVar30 = (uint)bVar3;
                }
                uStack_80 = (ulong)(uVar48 + uVar31);
                uVar13 = (uint)bVar37;
                uStack_a4 = uVar30;
                goto LAB_0011b008;
              }
            }
            uVar30 = (uint)*pbVar44;
            pbVar45 = pbVar44 + 1;
            uVar48 = (int)uStack_80 + 1;
            pbVar7[uStack_80] = *pbVar44;
            pbVar44 = pbVar45;
            if (pbVar45 == pbVar7 + lVar25) {
              pbVar44 = pbVar7;
            }
            uStack_a8 = uVar13;
          } while (uVar48 <= uVar32);
          *(uint *)((long)p + 0x510) = uVar28;
          *(uint *)((long)p + 0x514) = uStack_9c;
          *(ulong *)((long)p + 0x4c8) = uStack_58;
          *(uint *)((long)p + 0x4d0) = uVar14;
          *(uint **)((long)p + 0x498) = uStack_60;
          *(uint *)((long)p + 0x4f70) = uVar31;
          *(int *)((long)p + 0x4f80) = (int)uVar36;
          *(byte **)((long)p + 0x4f88) = pbVar44;
          *(int *)((long)p + 0x4f2c) = iVar27;
          *(int *)((long)p + 0x4f30) = iStack_a0;
          *(int *)((long)p + 0x4f34) = iVar40;
          *(int *)((long)p + 0x4f38) = iVar33;
          *(uint *)((long)p + 0x4f3c) = uVar42;
          *(uint *)((long)p + 0x4f44) = uVar30;
          *(uint *)((long)p + 0x4f48) = uVar13;
          *(uint *)((long)p + 0x4f18) = uVar48;
          *(undefined8 *)((long)p + 0x4f50) = *(undefined8 *)((long)p + 0x540);
          *(long *)((long)p + 0x4f58) = lVar25;
        } while( true );
      }
    }
    goto switchD_00117a53_caseD_338;
  }
  switch(iVar40) {
  case 0x337:
    lVar25 = *(long *)((long)p + 0x550);
    lVar26 = **(long **)((long)p + 0x558);
    *(long *)((long)p + 0x490) = lVar25;
    *(long *)((long)p + 0x498) = lVar25;
    *(long *)((long)p + 0x4a8) = lVar26;
    *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
    *(undefined1 *)((long)p + 0x4b0) = *(undefined1 *)((long)p + 0x570);
    *(long *)((long)p + 0x4f50) = *(long *)((long)p + 0x4f50) + *(long *)((long)p + 0x4f60);
    *(long *)((long)p + 0x4f58) = *(long *)((long)p + 0x4f58) - *(long *)((long)p + 0x4f60);
LAB_0011caac:
    uVar36 = *(ulong *)((long)p + 0x4f58);
    if (uVar36 != 0) {
      uVar21 = **(ulong **)((long)p + 0x568);
      if (uVar36 < **(ulong **)((long)p + 0x568)) {
        uVar21 = uVar36;
      }
      *(ulong *)((long)p + 0x4f60) = uVar21;
      if (*(int *)((long)p + 0x594) == 0) {
        memcpy(*(void **)((long)p + 0x560),*(void **)((long)p + 0x4f50),uVar21);
      }
      else {
        uVar36 = *(ulong *)((long)p + 0x4f60);
        if (uVar36 != 0) {
          uVar21 = 0;
          do {
            sVar46 = uVar36 - uVar21;
            if (0x1fff < sVar46) {
              sVar46 = 0x2000;
            }
            memcpy((void *)(*(long *)((long)p + 0x560) + uVar21),
                   (void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46);
            uVar15 = adler32((void *)(*(long *)((long)p + 0x4f50) + uVar21),sVar46,
                             *(uint *)((long)p + 0x548));
            *(uint *)((long)p + 0x548) = uVar15;
            uVar21 = uVar21 + sVar46;
            uVar36 = *(ulong *)((long)p + 0x4f60);
          } while (uVar21 < uVar36);
        }
      }
      **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = *(undefined8 *)((long)p + 0x4f60);
      *(undefined4 *)p = 0x337;
      return LZHAM_DECOMP_STATUS_NOT_FINISHED;
    }
    iStack_84 = *(int *)((long)p + 0x4f2c);
    iStack_a0 = *(int *)((long)p + 0x4f30);
    iVar33 = *(int *)((long)p + 0x4f34);
    iVar17 = *(int *)((long)p + 0x4f38);
    uVar42 = *(uint *)((long)p + 0x4f3c);
    uStack_a4 = *(uint *)((long)p + 0x4f44);
    uStack_a8 = *(uint *)((long)p + 0x4f48);
    uVar41 = *(undefined4 *)((long)p + 0x4f18);
    uVar28 = *(uint *)((long)p + 0x510);
    uStack_9c = *(uint *)((long)p + 0x514);
    uStack_60 = *(uint **)((long)p + 0x498);
    uStack_58 = *(ulong *)((long)p + 0x4c8);
    uVar14 = *(uint *)((long)p + 0x4d0);
LAB_0011cbd6:
    if (*(int *)((long)p + 0x598) == 2) {
      if ((uVar14 & 7) != 0) {
        for (; (int)uVar14 < 0; uVar14 = uVar14 + 8) {
          if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar28;
              *(uint *)((long)p + 0x514) = uStack_9c;
              *(ulong *)((long)p + 0x4c8) = uStack_58;
              *(uint *)((long)p + 0x4d0) = uVar14;
              *(uint **)((long)p + 0x498) = uStack_60;
              *(int *)((long)p + 0x4f2c) = iStack_84;
              *(int *)((long)p + 0x4f30) = iStack_a0;
              *(int *)((long)p + 0x4f34) = iVar33;
              *(int *)((long)p + 0x4f38) = iVar17;
              *(uint *)((long)p + 0x4f3c) = uVar42;
              *(uint *)((long)p + 0x4f44) = uStack_a4;
              *(uint *)((long)p + 0x4f48) = uStack_a8;
              *(undefined4 *)((long)p + 0x4f18) = uVar41;
              goto LAB_00118b3c;
            }
LAB_00119760:
            if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011cd33;
            uVar36 = 0;
          }
          else {
LAB_0011cd33:
            uVar36 = (ulong)(byte)*uStack_60;
            uStack_60 = (uint *)((long)uStack_60 + 1);
          }
          uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
        }
        uStack_58 = uStack_58 << ((byte)uVar14 & 7);
        uVar14 = uVar14 & 0x7ffffff8;
      }
      for (; (int)uVar14 < 0x10; uVar14 = uVar14 + 8) {
        if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar28;
            *(uint *)((long)p + 0x514) = uStack_9c;
            *(ulong *)((long)p + 0x4c8) = uStack_58;
            *(uint *)((long)p + 0x4d0) = uVar14;
            *(uint **)((long)p + 0x498) = uStack_60;
            *(int *)((long)p + 0x4f2c) = iStack_84;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iVar33;
            *(int *)((long)p + 0x4f38) = iVar17;
            *(uint *)((long)p + 0x4f3c) = uVar42;
            *(uint *)((long)p + 0x4f44) = uStack_a4;
            *(uint *)((long)p + 0x4f48) = uStack_a8;
            *(undefined4 *)((long)p + 0x4f18) = uVar41;
            goto LAB_00118bbd;
          }
LAB_001197dc:
          if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011ce0f;
          uVar36 = 0;
        }
        else {
LAB_0011ce0f:
          uVar36 = (ulong)(byte)*uStack_60;
          uStack_60 = (uint *)((long)uStack_60 + 1);
        }
        uStack_58 = uStack_58 | uVar36 << (0x38U - (char)uVar14 & 0x3f);
      }
      *(uint *)((long)p + 0x4f68) = (uint)(ushort)(uStack_58 >> 0x30);
      uVar36 = uStack_58 << 0x10;
      for (iVar40 = uVar14 - 0x10; iVar40 < 0x10; iVar40 = iVar40 + 8) {
        if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar28;
            *(uint *)((long)p + 0x514) = uStack_9c;
            *(ulong *)((long)p + 0x4c8) = uVar36;
            *(int *)((long)p + 0x4d0) = iVar40;
            *(uint **)((long)p + 0x498) = uStack_60;
            *(int *)((long)p + 0x4f2c) = iStack_84;
            *(int *)((long)p + 0x4f30) = iStack_a0;
            *(int *)((long)p + 0x4f34) = iVar33;
            *(int *)((long)p + 0x4f38) = iVar17;
            *(uint *)((long)p + 0x4f3c) = uVar42;
            *(uint *)((long)p + 0x4f44) = uStack_a4;
            *(uint *)((long)p + 0x4f48) = uStack_a8;
            *(undefined4 *)((long)p + 0x4f18) = uVar41;
            goto LAB_00118abb;
          }
LAB_001196e4:
          if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011cf87;
          uVar21 = 0;
        }
        else {
LAB_0011cf87:
          uVar21 = (ulong)(byte)*uStack_60;
          uStack_60 = (uint *)((long)uStack_60 + 1);
        }
        uVar36 = uVar36 | uVar21 << (0x38U - (char)iVar40 & 0x3f);
      }
      uStack_58 = uVar36 << 0x10;
      uVar14 = iVar40 - 0x10;
      uVar32 = *(int *)((long)p + 0x4f68) << 0x10 | (uint)(ushort)(uVar36 >> 0x30);
      *(uint *)((long)p + 0x4f68) = uVar32;
      if (*(int *)((long)p + 0x594) == 0) {
        *(uint *)((long)p + 0x548) = uVar32;
      }
      else if (uVar32 != *(uint *)((long)p + 0x548)) {
        *(undefined4 *)((long)p + 0x598) = 7;
      }
    }
    *(uint *)((long)p + 0x510) = uVar28;
    *(uint *)((long)p + 0x514) = uStack_9c;
    *(ulong *)((long)p + 0x4c8) = uStack_58;
    *(uint *)((long)p + 0x4d0) = uVar14;
    *(uint **)((long)p + 0x498) = uStack_60;
    uVar19 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x490));
    **(uint64 **)((long)p + 0x558) = uVar19;
    **(undefined8 **)((long)p + 0x568) = 0;
    goto LAB_0011cf52;
  case 0x338:
  case 0x339:
  case 0x33a:
  case 0x33b:
  case 0x33c:
  case 0x33e:
    goto switchD_00117a53_caseD_338;
  case 0x33d:
    lVar25 = *(long *)((long)p + 0x550);
    lVar26 = **(long **)((long)p + 0x558);
    *(long *)((long)p + 0x490) = lVar25;
    *(long *)((long)p + 0x498) = lVar25;
    *(long *)((long)p + 0x4a8) = lVar26;
    *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
    *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
    if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
      iStack_84 = *(int *)((long)p + 0x4f2c);
      iStack_a0 = *(int *)((long)p + 0x4f30);
      iVar33 = *(int *)((long)p + 0x4f34);
      iVar17 = *(int *)((long)p + 0x4f38);
      uVar42 = *(uint *)((long)p + 0x4f3c);
      uStack_a4 = *(uint *)((long)p + 0x4f44);
      uStack_a8 = *(uint *)((long)p + 0x4f48);
      uVar41 = *(undefined4 *)((long)p + 0x4f18);
      uVar28 = *(uint *)((long)p + 0x510);
      uStack_9c = *(uint *)((long)p + 0x514);
      uStack_60 = *(uint **)((long)p + 0x498);
      uStack_58 = *(ulong *)((long)p + 0x4c8);
      uVar14 = *(uint *)((long)p + 0x4d0);
      goto LAB_00119760;
    }
LAB_00118b3c:
    **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 0x33d;
    break;
  case 0x33f:
    lVar25 = *(long *)((long)p + 0x550);
    lVar26 = **(long **)((long)p + 0x558);
    *(long *)((long)p + 0x490) = lVar25;
    *(long *)((long)p + 0x498) = lVar25;
    *(long *)((long)p + 0x4a8) = lVar26;
    *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
    *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
    if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
      iStack_84 = *(int *)((long)p + 0x4f2c);
      iStack_a0 = *(int *)((long)p + 0x4f30);
      iVar33 = *(int *)((long)p + 0x4f34);
      iVar17 = *(int *)((long)p + 0x4f38);
      uVar42 = *(uint *)((long)p + 0x4f3c);
      uStack_a4 = *(uint *)((long)p + 0x4f44);
      uStack_a8 = *(uint *)((long)p + 0x4f48);
      uVar41 = *(undefined4 *)((long)p + 0x4f18);
      uVar28 = *(uint *)((long)p + 0x510);
      uStack_9c = *(uint *)((long)p + 0x514);
      uStack_60 = *(uint **)((long)p + 0x498);
      uStack_58 = *(ulong *)((long)p + 0x4c8);
      uVar14 = *(uint *)((long)p + 0x4d0);
      goto LAB_001197dc;
    }
LAB_00118bbd:
    **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 0x33f;
    break;
  case 0x340:
    lVar25 = *(long *)((long)p + 0x550);
    lVar26 = **(long **)((long)p + 0x558);
    *(long *)((long)p + 0x490) = lVar25;
    *(long *)((long)p + 0x498) = lVar25;
    *(long *)((long)p + 0x4a8) = lVar26;
    *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
    *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
    if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
      iStack_84 = *(int *)((long)p + 0x4f2c);
      iStack_a0 = *(int *)((long)p + 0x4f30);
      iVar33 = *(int *)((long)p + 0x4f34);
      iVar17 = *(int *)((long)p + 0x4f38);
      uVar42 = *(uint *)((long)p + 0x4f3c);
      uStack_a4 = *(uint *)((long)p + 0x4f44);
      uStack_a8 = *(uint *)((long)p + 0x4f48);
      uVar41 = *(undefined4 *)((long)p + 0x4f18);
      uVar28 = *(uint *)((long)p + 0x510);
      uStack_9c = *(uint *)((long)p + 0x514);
      uStack_60 = *(uint **)((long)p + 0x498);
      uVar36 = *(ulong *)((long)p + 0x4c8);
      iVar40 = *(int *)((long)p + 0x4d0);
      goto LAB_001196e4;
    }
LAB_00118abb:
    **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
    **(undefined8 **)((long)p + 0x568) = 0;
    *(undefined4 *)p = 0x340;
    break;
  default:
    if (iVar40 == 0x325) {
      lVar25 = *(long *)((long)p + 0x550);
      lVar26 = **(long **)((long)p + 0x558);
      *(long *)((long)p + 0x490) = lVar25;
      *(long *)((long)p + 0x498) = lVar25;
      *(long *)((long)p + 0x4a8) = lVar26;
      *(long *)((long)p + 0x4a0) = lVar25 + lVar26;
      *(char *)((long)p + 0x4b0) = *(char *)((long)p + 0x570);
      if ((*(char *)((long)p + 0x570) != '\0') || (lVar26 != 0)) {
        iStack_84 = *(int *)((long)p + 0x4f2c);
        iStack_a0 = *(int *)((long)p + 0x4f30);
        iVar33 = *(int *)((long)p + 0x4f34);
        iVar17 = *(int *)((long)p + 0x4f38);
        uVar42 = *(uint *)((long)p + 0x4f3c);
        uStack_a4 = *(uint *)((long)p + 0x4f44);
        uStack_a8 = *(uint *)((long)p + 0x4f48);
        uStack_80 = (ulong)*(uint *)((long)p + 0x4f18);
        uVar28 = *(uint *)((long)p + 0x510);
        uStack_9c = *(uint *)((long)p + 0x514);
        uStack_60 = *(uint **)((long)p + 0x498);
        uStack_58 = *(ulong *)((long)p + 0x4c8);
        uVar14 = *(uint *)((long)p + 0x4d0);
        do {
          if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011cc48;
          uVar36 = 0;
          while( true ) {
            cVar11 = (char)uVar14;
            uVar14 = uVar14 + 8;
            uStack_58 = uStack_58 | uVar36 << (0x38U - cVar11 & 0x3f);
LAB_0011c9ef:
            if (-1 < (int)uVar14) {
              uStack_58 = uStack_58 << ((byte)uVar14 & 7);
              uVar14 = uVar14 & 0x7ffffff8;
              goto LAB_0011ca05;
            }
            if (uStack_60 == *(uint **)((long)p + 0x4a0)) break;
LAB_0011cc48:
            uVar36 = (ulong)(byte)*uStack_60;
            uStack_60 = (uint *)((long)uStack_60 + 1);
          }
        } while (*(char *)((long)p + 0x4b0) != '\0');
        *(uint *)((long)p + 0x510) = uVar28;
        *(uint *)((long)p + 0x514) = uStack_9c;
        *(ulong *)((long)p + 0x4c8) = uStack_58;
        *(uint *)((long)p + 0x4d0) = uVar14;
        *(uint **)((long)p + 0x498) = uStack_60;
        *(int *)((long)p + 0x4f2c) = iStack_84;
        *(int *)((long)p + 0x4f30) = iStack_a0;
        *(int *)((long)p + 0x4f34) = iVar33;
        *(int *)((long)p + 0x4f38) = iVar17;
        *(uint *)((long)p + 0x4f3c) = uVar42;
        *(uint *)((long)p + 0x4f44) = uStack_a4;
        *(uint *)((long)p + 0x4f48) = uStack_a8;
        *(int *)((long)p + 0x4f18) = (int)uStack_80;
      }
      **(long **)((long)p + 0x558) = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      *(undefined4 *)p = 0x325;
      return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
    }
    if (iVar40 != 0x35c) goto switchD_00117a53_caseD_338;
LAB_0011cf52:
    *(undefined4 *)p = 0x35c;
switchD_00117a53_caseD_338:
    return *(lzham_decompress_status_t *)((long)p + 0x598);
  }
  return LZHAM_DECOMP_STATUS_NEEDS_MORE_INPUT;
LAB_0011acea:
  if (7 < iVar40) goto code_r0x0011acf2;
  if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar28;
      *(uint *)((long)p + 0x514) = uStack_9c;
      *(ulong *)((long)p + 0x4c8) = uVar36;
      *(int *)((long)p + 0x4d0) = iVar40;
      *(uint **)((long)p + 0x498) = uStack_60;
      *(undefined4 *)((long)p + 0x4f2c) = uVar39;
      *(int *)((long)p + 0x4f30) = iStack_a0;
      *(undefined4 *)((long)p + 0x4f34) = uVar29;
      *(undefined4 *)((long)p + 0x4f38) = uVar41;
      *(undefined4 *)((long)p + 0x4f3c) = uVar43;
      *(uint *)((long)p + 0x4f44) = uStack_a4;
      *(uint *)((long)p + 0x4f48) = uStack_a8;
      *(int *)((long)p + 0x4f18) = (int)uStack_80;
      goto LAB_00118a3a;
    }
LAB_00119656:
    uVar21 = 0;
    if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011ad1c;
  }
  else {
LAB_0011ad1c:
    uVar21 = (ulong)(byte)*uStack_60;
    uStack_60 = (uint *)((long)uStack_60 + 1);
  }
  cVar11 = (char)iVar40;
  iVar40 = iVar40 + 8;
  uVar36 = uVar36 | uVar21 << (0x38U - cVar11 & 0x3f);
  goto LAB_0011acea;
code_r0x0011acf2:
  uVar21 = uVar36 << 8;
  uVar28 = (uint)(uVar36 >> 0x28) & 0xff0000 | uVar28;
  for (iVar40 = iVar40 + -8; iVar40 < 8; iVar40 = iVar40 + 8) {
    if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar28;
        *(uint *)((long)p + 0x514) = uStack_9c;
        *(ulong *)((long)p + 0x4c8) = uVar21;
        *(int *)((long)p + 0x4d0) = iVar40;
        *(uint **)((long)p + 0x498) = uStack_60;
        *(undefined4 *)((long)p + 0x4f2c) = uVar39;
        *(int *)((long)p + 0x4f30) = iStack_a0;
        *(undefined4 *)((long)p + 0x4f34) = uVar29;
        *(undefined4 *)((long)p + 0x4f38) = uVar41;
        *(undefined4 *)((long)p + 0x4f3c) = uVar43;
        *(uint *)((long)p + 0x4f44) = uStack_a4;
        *(uint *)((long)p + 0x4f48) = uStack_a8;
        *(int *)((long)p + 0x4f18) = (int)uStack_80;
        goto LAB_001180ab;
      }
LAB_00118e2d:
      uVar36 = 0;
      if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011ae1a;
    }
    else {
LAB_0011ae1a:
      uVar36 = (ulong)(byte)*uStack_60;
      uStack_60 = (uint *)((long)uStack_60 + 1);
    }
    uVar21 = uVar21 | uVar36 << (0x38U - (char)iVar40 & 0x3f);
  }
  uVar36 = uVar21 << 8;
  iVar40 = iVar40 + -8;
  uVar28 = (ushort)(uVar21 >> 0x30) & 0xff00 | uVar28;
  do {
    if (7 < iVar40) {
      uStack_58 = uVar36 << 8;
      uVar14 = iVar40 - 8;
      uVar28 = uVar28 | (byte)(uVar36 >> 0x38);
      *(int *)((long)p + 0x4f40) = (int)uStack_80;
      iVar33 = 1;
      uStack_a4 = 0;
      uVar13 = 0;
      uVar42 = 0;
      iVar40 = 1;
      iStack_a0 = 1;
      iVar27 = 1;
      goto LAB_0011b008;
    }
    if (uStack_60 == *(uint **)((long)p + 0x4a0)) {
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar28;
        *(uint *)((long)p + 0x514) = uStack_9c;
        *(ulong *)((long)p + 0x4c8) = uVar36;
        *(int *)((long)p + 0x4d0) = iVar40;
        *(uint **)((long)p + 0x498) = uStack_60;
        *(undefined4 *)((long)p + 0x4f2c) = uVar39;
        *(int *)((long)p + 0x4f30) = iStack_a0;
        *(undefined4 *)((long)p + 0x4f34) = uVar29;
        *(undefined4 *)((long)p + 0x4f38) = uVar41;
        *(undefined4 *)((long)p + 0x4f3c) = uVar43;
        *(uint *)((long)p + 0x4f44) = uStack_a4;
        *(uint *)((long)p + 0x4f48) = uStack_a8;
        *(int *)((long)p + 0x4f18) = (int)uStack_80;
        goto LAB_001183d7;
      }
LAB_001192ed:
      uVar21 = 0;
      if (uStack_60 < *(uint **)((long)p + 0x4a0)) goto LAB_0011af3b;
    }
    else {
LAB_0011af3b:
      uVar21 = (ulong)(byte)*uStack_60;
      uStack_60 = (uint *)((long)uStack_60 + 1);
    }
    cVar11 = (char)iVar40;
    iVar40 = iVar40 + 8;
    uVar36 = uVar36 | uVar21 << (0x38U - cVar11 & 0x3f);
  } while( true );
LAB_00119e3c:
  uVar36 = (ulong)(byte)*uStack_60;
  uStack_60 = (uint *)((long)uStack_60 + 1);
  goto LAB_00119e4c;
code_r0x0011aaa7:
  lVar26 = *(long *)((long)p + 0x498) - *(long *)((long)p + 0x490);
  uVar36 = **(long **)((long)p + 0x558) - lVar26;
  goto LAB_0011a078;
LAB_001146a3:
  uVar36 = (ulong)(byte)*puStack_98;
  puStack_98 = (uint *)((long)puStack_98 + 1);
  goto LAB_001146b3;
LAB_0011519c:
  if (7 < iVar40) goto code_r0x001151a1;
  if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
    if (*(char *)((long)p + 0x4b0) == '\0') {
      *(uint *)((long)p + 0x510) = uVar32;
      *(uint *)((long)p + 0x514) = (uint)uStack_80;
      *(ulong *)((long)p + 0x4c8) = uVar35;
      *(int *)((long)p + 0x4d0) = iVar40;
      *(uint **)((long)p + 0x498) = puStack_98;
      *(undefined4 *)((long)p + 0x4f2c) = uVar41;
      *(undefined4 *)((long)p + 0x4f30) = uVar39;
      *(undefined4 *)((long)p + 0x4f34) = uVar22;
      *(int *)((long)p + 0x4f38) = iStack_a0;
      *(undefined4 *)((long)p + 0x4f3c) = uVar29;
      *(undefined4 *)((long)p + 0x4f44) = uVar43;
      *(undefined4 *)((long)p + 0x4f48) = uVar38;
      *(int *)((long)p + 0x4f18) = (int)uVar49;
      goto LAB_00112db3;
    }
LAB_00113ba3:
    uVar21 = 0;
    if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_001151d0;
  }
  else {
LAB_001151d0:
    uVar21 = (ulong)(byte)*puStack_98;
    puStack_98 = (uint *)((long)puStack_98 + 1);
  }
  cVar11 = (char)iVar40;
  iVar40 = iVar40 + 8;
  uVar35 = uVar35 | uVar21 << (0x38U - cVar11 & 0x3f);
  goto LAB_0011519c;
code_r0x001151a1:
  uVar21 = uVar35 << 8;
  uVar32 = (uint)(uVar35 >> 0x28) & 0xff0000 | uVar32;
  for (iVar40 = iVar40 + -8; iVar40 < 8; iVar40 = iVar40 + 8) {
    if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar32;
        *(uint *)((long)p + 0x514) = (uint)uStack_80;
        *(ulong *)((long)p + 0x4c8) = uVar21;
        *(int *)((long)p + 0x4d0) = iVar40;
        *(uint **)((long)p + 0x498) = puStack_98;
        *(undefined4 *)((long)p + 0x4f2c) = uVar41;
        *(undefined4 *)((long)p + 0x4f30) = uVar39;
        *(undefined4 *)((long)p + 0x4f34) = uVar22;
        *(int *)((long)p + 0x4f38) = iStack_a0;
        *(undefined4 *)((long)p + 0x4f3c) = uVar29;
        *(undefined4 *)((long)p + 0x4f44) = uVar43;
        *(undefined4 *)((long)p + 0x4f48) = uVar38;
        *(int *)((long)p + 0x4f18) = (int)uVar49;
        goto LAB_00112438;
      }
LAB_001131ab:
      uVar35 = 0;
      if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_001152be;
    }
    else {
LAB_001152be:
      uVar35 = (ulong)(byte)*puStack_98;
      puStack_98 = (uint *)((long)puStack_98 + 1);
    }
    uVar21 = uVar21 | uVar35 << (0x38U - (char)iVar40 & 0x3f);
  }
  uVar35 = uVar21 << 8;
  uVar32 = (ushort)(uVar21 >> 0x30) & 0xff00 | uVar32;
  for (iVar40 = iVar40 + -8; iVar40 < 8; iVar40 = iVar40 + 8) {
    if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
      if (*(char *)((long)p + 0x4b0) == '\0') {
        *(uint *)((long)p + 0x510) = uVar32;
        *(uint *)((long)p + 0x514) = (uint)uStack_80;
        *(ulong *)((long)p + 0x4c8) = uVar35;
        *(int *)((long)p + 0x4d0) = iVar40;
        *(uint **)((long)p + 0x498) = puStack_98;
        *(undefined4 *)((long)p + 0x4f2c) = uVar41;
        *(undefined4 *)((long)p + 0x4f30) = uVar39;
        *(undefined4 *)((long)p + 0x4f34) = uVar22;
        *(int *)((long)p + 0x4f38) = iStack_a0;
        *(undefined4 *)((long)p + 0x4f3c) = uVar29;
        *(undefined4 *)((long)p + 0x4f44) = uVar43;
        *(undefined4 *)((long)p + 0x4f48) = uVar38;
        *(int *)((long)p + 0x4f18) = (int)uVar49;
        goto LAB_00112767;
      }
LAB_0011366c:
      uVar21 = 0;
      if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_001153e7;
    }
    else {
LAB_001153e7:
      uVar21 = (ulong)(byte)*puStack_98;
      puStack_98 = (uint *)((long)puStack_98 + 1);
    }
    uVar35 = uVar35 | uVar21 << (0x38U - (char)iVar40 & 0x3f);
  }
  uVar21 = uVar35 << 8;
  prStack_68._0_4_ = iVar40 - 8;
  uVar32 = uVar32 | (byte)(uVar35 >> 0x38);
  *(int *)((long)p + 0x4f40) = (int)uVar49;
  iStack_a0 = 1;
  uStack_9c = 0;
  uVar14 = 0;
  uVar13 = 0;
  uStack_80._4_4_ = 1;
  uStack_60._4_4_ = 1;
  iVar40 = 1;
LAB_001154b5:
  puVar18 = (ushort *)((long)p + (ulong)(uVar13 * 0x40 + (uVar14 >> 2)) * 2 + 0x48a0);
  uVar23 = (ulong)uVar13;
  for (; (uint)uStack_80 < 0x1000000; uStack_80._0_4_ = (uint)uStack_80 << 8) {
    *(ushort **)((long)p + 0x528) = puVar18;
    uVar35 = uVar21;
    for (; (int)(uint)prStack_68 < 8; prStack_68._0_4_ = (uint)prStack_68 + 8) {
      if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
        uVar13 = (uint)uVar23;
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar32;
          *(uint *)((long)p + 0x514) = (uint)uStack_80;
          *(ulong *)((long)p + 0x4c8) = uVar35;
          *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(int *)((long)p + 0x4f2c) = iVar40;
          *(int *)((long)p + 0x4f30) = uStack_60._4_4_;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uVar13;
          *(uint *)((long)p + 0x4f44) = uVar14;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
          goto LAB_0011297d;
        }
LAB_00113962:
        uVar21 = 0;
        uVar23 = (ulong)uVar13;
        if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00115a0a;
      }
      else {
LAB_00115a0a:
        uVar21 = (ulong)(byte)*puStack_98;
        puStack_98 = (uint *)((long)puStack_98 + 1);
      }
      uVar35 = uVar35 | uVar21 << (0x38U - (char)(uint)prStack_68 & 0x3f);
    }
    uVar21 = uVar35 << 8;
    prStack_68._0_4_ = (uint)prStack_68 - 8;
    puVar18 = *(ushort **)((long)p + 0x528);
    uVar32 = uVar32 << 8 | (uint)(byte)(uVar35 >> 0x38);
  }
  uVar13 = (uint)uVar23;
  uVar4 = *puVar18;
  uVar42 = ((uint)uStack_80 >> 0xb) * (uint)uVar4;
  uStack_8c = uVar32 - uVar42;
  if (uVar32 < uVar42) {
    *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
    if (uVar36 <= (uVar49 & 0xffffffff)) {
      *(uint *)((long)p + 0x510) = uVar32;
      *(uint *)((long)p + 0x514) = uVar42;
      *(ulong *)((long)p + 0x4c8) = uVar21;
      *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
      *(uint **)((long)p + 0x498) = puStack_98;
      **(long **)((long)p + 0x558) = (long)puStack_98 - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      goto LAB_0011227d;
    }
    uStack_70 = uVar14;
    if (uVar13 < 7) {
      uVar28 = uStack_9c >> 2 & 0xfffffff8 | uVar14 >> 5;
      prStack_78 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar28 * 0x80 + 0x5a0)
      ;
      pdVar24 = *(decoder_tables **)((long)p + (ulong)uVar28 * 0x80 + 0x5d0);
      if ((int)(uint)prStack_68 < 0x18) {
        if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
          uVar14 = *puStack_98;
          prStack_68._0_4_ = (uint)prStack_68 + 0x20;
          uVar21 = uVar21 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                    (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                            (-(char)(uint)prStack_68 & 0x3fU);
          puStack_98 = puStack_98 + 1;
        }
        else {
          for (; uStack_70 = uVar14, (int)(uint)prStack_68 < 0x18;
              prStack_68._0_4_ = (uint)prStack_68 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prStack_78;
              *(uint *)((long)p + 0x510) = uVar32;
              *(uint *)((long)p + 0x514) = uVar42;
              *(ulong *)((long)p + 0x4c8) = uVar21;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(int *)((long)p + 0x4f2c) = iVar40;
              *(int *)((long)p + 0x4f30) = uStack_60._4_4_;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uVar13;
              *(uint *)((long)p + 0x4f44) = uVar14;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_00115c06;
            }
LAB_00115ade:
            uVar35 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
              uVar35 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
            uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
          }
        }
      }
      uVar14 = (uint)(ushort)(uVar21 >> 0x30);
      if (uVar14 < pdVar24->m_table_max_code) {
        uVar14 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
        uVar28 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar27 = pdVar24->m_decode_start_code_size - 0x41;
        do {
          iVar17 = iVar27;
          iVar27 = iVar17 + 1;
        } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar14);
        uVar28 = (int)(uVar21 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                 pdVar24->m_val_ptrs[iVar17 + 0x40U];
        uVar14 = 0;
        if (uVar28 < prStack_78->m_total_syms) {
          uVar14 = uVar28;
        }
        uVar14 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar14];
        uVar28 = iVar17 + 0x41;
      }
      uVar21 = uVar21 << ((byte)uVar28 & 0x3f);
      puVar2 = (prStack_78->m_sym_freq).m_p + uVar14;
      *puVar2 = *puVar2 + 1;
      prStack_68._0_4_ = (uint)prStack_68 - uVar28;
      puVar1 = &prStack_78->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      uStack_80._0_4_ = uVar42;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prStack_78);
      }
    }
    else {
      uVar30 = (int)uVar49 - iVar40;
      uVar28 = (uint)pbVar7[uVar30];
      uVar30 = (pbVar7[uVar30 - 1] >> 2 & 0x38 | (uint)(pbVar7[uVar30] >> 5)) << 7;
      prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + (ulong)uVar30 + 0x25a0);
      pdVar24 = *(decoder_tables **)((long)p + (ulong)uVar30 + 0x25d0);
      uStack_80._0_4_ = uVar42;
      if ((int)(uint)prStack_68 < 0x18) {
        if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
          uVar14 = *puStack_98;
          prStack_68._0_4_ = (uint)prStack_68 + 0x20;
          uVar21 = uVar21 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                    (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                            (-(char)(uint)prStack_68 & 0x3fU);
          puStack_98 = puStack_98 + 1;
        }
        else {
          for (; uStack_70 = uVar14, (int)(uint)prStack_68 < 0x18;
              prStack_68._0_4_ = (uint)prStack_68 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
              *(uint *)((long)p + 0x510) = uVar32;
              *(uint *)((long)p + 0x514) = (uint)uStack_80;
              *(ulong *)((long)p + 0x4c8) = uVar21;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(uint *)((long)p + 0x4f6c) = uVar28;
              *(int *)((long)p + 0x4f2c) = iVar40;
              *(int *)((long)p + 0x4f30) = uStack_60._4_4_;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uVar13;
              *(uint *)((long)p + 0x4f44) = uVar14;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_00115dd7;
            }
LAB_00115ca5:
            uVar35 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
              uVar35 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
            uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
          }
        }
      }
      uVar14 = (uint)(ushort)(uVar21 >> 0x30);
      if (uVar14 < pdVar24->m_table_max_code) {
        uVar14 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
        uVar42 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar27 = pdVar24->m_decode_start_code_size - 0x41;
        do {
          iVar17 = iVar27;
          iVar27 = iVar17 + 1;
        } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar14);
        uVar42 = (int)(uVar21 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                 pdVar24->m_val_ptrs[iVar17 + 0x40U];
        uVar14 = 0;
        if (uVar42 < prVar47->m_total_syms) {
          uVar14 = uVar42;
        }
        uVar14 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar14];
        uVar42 = iVar17 + 0x41;
      }
      uVar21 = uVar21 << ((byte)uVar42 & 0x3f);
      puVar2 = (prVar47->m_sym_freq).m_p + uVar14;
      *puVar2 = *puVar2 + 1;
      prStack_68._0_4_ = (uint)prStack_68 - uVar42;
      puVar1 = &prVar47->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar47);
      }
      uVar14 = uVar14 ^ uVar28;
    }
    pbVar7[uVar49 & 0xffffffff] = (byte)uVar14;
    uVar13 = (uint)(byte)s_literal_next_state[uVar13];
    uVar49 = (ulong)((int)uVar49 + 1);
    uStack_9c = uStack_70;
    goto LAB_001154b5;
  }
  *puVar18 = uVar4 - (uVar4 >> 5);
  puVar18 = (ushort *)(uVar23 * 2 + 0x4ea0 + (long)p);
  uVar28 = 1;
  iStack_6c = uStack_60._4_4_;
  for (uVar42 = (uint)uStack_80 - uVar42; uVar42 < 0x1000000; uVar42 = uVar42 << 8) {
    *(ushort **)((long)p + 0x528) = puVar18;
    uVar35 = uVar21;
    for (; (int)(uint)prStack_68 < 8; prStack_68._0_4_ = (uint)prStack_68 + 8) {
      if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uStack_8c;
          *(uint *)((long)p + 0x514) = uVar42;
          *(ulong *)((long)p + 0x4c8) = uVar35;
          *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(uint *)((long)p + 0x4f70) = uVar28;
          *(int *)((long)p + 0x4f2c) = iVar40;
          *(int *)((long)p + 0x4f30) = iStack_6c;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uVar13;
          *(uint *)((long)p + 0x4f44) = uVar14;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
          goto LAB_0011287b;
        }
LAB_0011383c:
        uVar21 = 0;
        if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_0011600c;
      }
      else {
LAB_0011600c:
        uVar21 = (ulong)(byte)*puStack_98;
        puStack_98 = (uint *)((long)puStack_98 + 1);
      }
      uVar35 = uVar35 | uVar21 << (0x38U - (char)(uint)prStack_68 & 0x3f);
    }
    uVar21 = uVar35 << 8;
    prStack_68._0_4_ = (uint)prStack_68 - 8;
    puVar18 = *(ushort **)((long)p + 0x528);
    uStack_8c = uStack_8c << 8 | (uint)(byte)(uVar35 >> 0x38);
  }
  uVar4 = *puVar18;
  uStack_80._0_4_ = (uVar42 >> 0xb) * (uint)uVar4;
  uVar30 = uStack_8c - (uint)uStack_80;
  if ((uint)uStack_80 <= uStack_8c) {
    *puVar18 = uVar4 - (uVar4 >> 5);
    puVar18 = (ushort *)((long)p + (ulong)uVar13 * 2 + 0x4eb8);
    for (uVar42 = uVar42 - (uint)uStack_80; uVar42 < 0x1000000; uVar42 = uVar42 << 8) {
      *(ushort **)((long)p + 0x528) = puVar18;
      uVar35 = uVar21;
      for (; (int)(uint)prStack_68 < 8; prStack_68._0_4_ = (uint)prStack_68 + 8) {
        if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar30;
            *(uint *)((long)p + 0x514) = uVar42;
            *(ulong *)((long)p + 0x4c8) = uVar35;
            *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
            *(uint **)((long)p + 0x498) = puStack_98;
            *(uint *)((long)p + 0x4f70) = uVar28;
            *(int *)((long)p + 0x4f2c) = iVar40;
            *(int *)((long)p + 0x4f30) = iStack_6c;
            *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
            *(int *)((long)p + 0x4f38) = iStack_a0;
            *(uint *)((long)p + 0x4f3c) = uVar13;
            *(uint *)((long)p + 0x4f44) = uVar14;
            *(uint *)((long)p + 0x4f48) = uStack_9c;
            *(int *)((long)p + 0x4f18) = (int)uVar49;
            goto LAB_001120a0;
          }
LAB_001132c6:
          uVar21 = 0;
          if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_001148e2;
        }
        else {
LAB_001148e2:
          uVar21 = (ulong)(byte)*puStack_98;
          puStack_98 = (uint *)((long)puStack_98 + 1);
        }
        uVar35 = uVar35 | uVar21 << (0x38U - (char)(uint)prStack_68 & 0x3f);
      }
      uVar21 = uVar35 << 8;
      prStack_68._0_4_ = (uint)prStack_68 - 8;
      puVar18 = *(ushort **)((long)p + 0x528);
      uVar30 = uVar30 << 8 | (uint)(byte)(uVar35 >> 0x38);
    }
    uVar4 = *puVar18;
    uStack_80._0_4_ = (uVar42 >> 0xb) * (uint)uVar4;
    uVar31 = uVar30 - (uint)uStack_80;
    if (uVar30 < (uint)uStack_80) {
      *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
      prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                ((long)p + (ulong)(6 < uVar13) * 0x80 + 0x4620);
      pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar13) * 0x80 + 18000);
      uStack_70 = uVar14;
      if ((int)(uint)prStack_68 < 0x18) {
        if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
          uVar32 = *puStack_98;
          prStack_68._0_4_ = (uint)prStack_68 + 0x20;
          uVar21 = uVar21 | (ulong)(uVar32 >> 0x18 | (uVar32 & 0xff0000) >> 8 |
                                    (uVar32 & 0xff00) << 8 | uVar32 << 0x18) <<
                            (-(char)(uint)prStack_68 & 0x3fU);
          puStack_98 = puStack_98 + 1;
        }
        else {
          for (; uStack_70 = uVar14, (int)(uint)prStack_68 < 0x18;
              prStack_68._0_4_ = (uint)prStack_68 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
              *(uint *)((long)p + 0x510) = uVar30;
              *(uint *)((long)p + 0x514) = (uint)uStack_80;
              *(ulong *)((long)p + 0x4c8) = uVar21;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(uint *)((long)p + 0x4f70) = uVar28;
              *(int *)((long)p + 0x4f2c) = iVar40;
              *(int *)((long)p + 0x4f30) = iStack_6c;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uVar13;
              *(uint *)((long)p + 0x4f44) = uVar14;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_001140e1;
            }
LAB_0011402b:
            uVar35 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
              uVar35 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
            uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
          }
        }
      }
      uVar32 = (uint)(ushort)(uVar21 >> 0x30);
      if (uVar32 < pdVar24->m_table_max_code) {
        uVar28 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
        uVar32 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar27 = pdVar24->m_decode_start_code_size - 0x41;
        do {
          iVar17 = iVar27;
          iVar27 = iVar17 + 1;
        } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar32);
        uVar14 = (int)(uVar21 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                 pdVar24->m_val_ptrs[iVar17 + 0x40U];
        uVar32 = 0;
        if (uVar14 < prVar47->m_total_syms) {
          uVar32 = uVar14;
        }
        uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar32];
        uVar32 = iVar17 + 0x41;
      }
      uVar21 = uVar21 << ((byte)uVar32 & 0x3f);
      puVar2 = (prVar47->m_sym_freq).m_p + uVar28;
      *puVar2 = *puVar2 + 1;
      prStack_68._0_4_ = (uint)prStack_68 - uVar32;
      puVar1 = &prVar47->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar47);
      }
      uVar28 = uVar28 + 2;
      puVar18 = (ushort *)((long)p + (ulong)uVar13 * 2 + 0x4ee8);
      uStack_8c = uVar13;
      for (; (uint)uStack_80 < 0x1000000; uStack_80._0_4_ = (uint)uStack_80 << 8) {
        *(ushort **)((long)p + 0x528) = puVar18;
        uVar35 = uVar21;
        for (; (int)(uint)prStack_68 < 8; prStack_68._0_4_ = (uint)prStack_68 + 8) {
          if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar30;
              *(uint *)((long)p + 0x514) = (uint)uStack_80;
              *(ulong *)((long)p + 0x4c8) = uVar35;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(uint *)((long)p + 0x4f70) = uVar28;
              *(int *)((long)p + 0x4f2c) = iVar40;
              *(int *)((long)p + 0x4f30) = iStack_6c;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uStack_8c;
              *(uint *)((long)p + 0x4f44) = uStack_70;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_001128fc;
            }
LAB_001138d5:
            uVar21 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00116655;
          }
          else {
LAB_00116655:
            uVar21 = (ulong)(byte)*puStack_98;
            puStack_98 = (uint *)((long)puStack_98 + 1);
          }
          uVar35 = uVar35 | uVar21 << (0x38U - (char)(uint)prStack_68 & 0x3f);
        }
        uVar21 = uVar35 << 8;
        prStack_68._0_4_ = (uint)prStack_68 - 8;
        puVar18 = *(ushort **)((long)p + 0x528);
        uVar30 = uVar30 << 8 | (uint)(byte)(uVar35 >> 0x38);
      }
      uVar4 = *puVar18;
      uVar14 = ((uint)uStack_80 >> 0xb) * (uint)uVar4;
      uStack_60._4_4_ = iVar40;
      if (uVar30 < uVar14) {
        *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
        puVar18 = (ushort *)((long)p + (ulong)uStack_8c * 2 + 0x4f00);
        for (; uVar14 < 0x1000000; uVar14 = uVar14 << 8) {
          *(ushort **)((long)p + 0x528) = puVar18;
          uVar35 = uVar21;
          for (; (int)(uint)prStack_68 < 8; prStack_68._0_4_ = (uint)prStack_68 + 8) {
            if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(uint *)((long)p + 0x510) = uVar30;
                *(uint *)((long)p + 0x514) = uVar14;
                *(ulong *)((long)p + 0x4c8) = uVar35;
                *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
                *(uint **)((long)p + 0x498) = puStack_98;
                *(uint *)((long)p + 0x4f70) = uVar28;
                *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
                *(int *)((long)p + 0x4f30) = iStack_6c;
                *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
                *(int *)((long)p + 0x4f38) = iStack_a0;
                *(uint *)((long)p + 0x4f3c) = uStack_8c;
                *(uint *)((long)p + 0x4f44) = uStack_70;
                *(uint *)((long)p + 0x4f48) = uStack_9c;
                *(int *)((long)p + 0x4f18) = (int)uVar49;
                goto LAB_00112233;
              }
LAB_0011335d:
              uVar21 = 0;
              if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00114a01;
            }
            else {
LAB_00114a01:
              uVar21 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
            uVar35 = uVar35 | uVar21 << (0x38U - (char)(uint)prStack_68 & 0x3f);
          }
          uVar21 = uVar35 << 8;
          prStack_68._0_4_ = (uint)prStack_68 - 8;
          puVar18 = *(ushort **)((long)p + 0x528);
          uVar30 = uVar30 << 8 | (uint)(byte)(uVar35 >> 0x38);
        }
        uVar4 = *puVar18;
        uStack_80._0_4_ = (uVar14 >> 0xb) * (uint)uVar4;
        uVar32 = uVar30 - (uint)uStack_80;
        if (uVar30 < (uint)uStack_80) {
          *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
          iVar40 = iStack_a0;
          iStack_a0 = uStack_80._4_4_;
          uStack_80._4_4_ = iStack_6c;
          uVar32 = uVar30;
        }
        else {
          *puVar18 = uVar4 - (uVar4 >> 5);
          uStack_80._0_4_ = uVar14 - (uint)uStack_80;
          iVar40 = uStack_80._4_4_;
          uStack_80._4_4_ = iStack_6c;
        }
      }
      else {
        *puVar18 = uVar4 - (uVar4 >> 5);
        uStack_80._0_4_ = (uint)uStack_80 - uVar14;
        iVar40 = iStack_6c;
        uVar32 = uVar30 - uVar14;
      }
      uVar13 = (uint)(6 < uStack_8c) * 3 + 8;
    }
    else {
      *puVar18 = uVar4 - (uVar4 >> 5);
      puVar18 = (ushort *)((long)p + (ulong)uVar13 * 2 + 0x4ed0);
      uStack_60._4_4_ = iStack_6c;
      for (uVar42 = uVar42 - (uint)uStack_80; uVar42 < 0x1000000; uVar42 = uVar42 << 8) {
        *(ushort **)((long)p + 0x528) = puVar18;
        uVar35 = uVar21;
        iStack_6c = uStack_60._4_4_;
        for (; (int)(uint)prStack_68 < 8; prStack_68._0_4_ = (uint)prStack_68 + 8) {
          if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar31;
              *(uint *)((long)p + 0x514) = uVar42;
              *(ulong *)((long)p + 0x4c8) = uVar35;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(uint *)((long)p + 0x4f70) = uVar28;
              *(int *)((long)p + 0x4f2c) = iVar40;
              *(int *)((long)p + 0x4f30) = iStack_6c;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uVar13;
              *(uint *)((long)p + 0x4f44) = uVar14;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_0011253a;
            }
LAB_00113491:
            uVar21 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00116439;
          }
          else {
LAB_00116439:
            uVar21 = (ulong)(byte)*puStack_98;
            puStack_98 = (uint *)((long)puStack_98 + 1);
          }
          uVar35 = uVar35 | uVar21 << (0x38U - (char)(uint)prStack_68 & 0x3f);
        }
        uVar21 = uVar35 << 8;
        prStack_68._0_4_ = (uint)prStack_68 - 8;
        puVar18 = *(ushort **)((long)p + 0x528);
        uVar31 = uVar31 << 8 | (uint)(byte)(uVar35 >> 0x38);
        uStack_60._4_4_ = iStack_6c;
      }
      uVar4 = *puVar18;
      uStack_80._0_4_ = (uVar42 >> 0xb) * (uint)uVar4;
      uVar32 = uVar31 - (uint)uStack_80;
      uStack_70 = uVar14;
      if (uVar31 < (uint)uStack_80) {
        *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
        prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                  ((long)p + (ulong)(6 < uVar13) * 0x80 + 0x4620);
        pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uVar13) * 0x80 + 18000);
        uVar32 = uVar31;
        if ((int)(uint)prStack_68 < 0x18) {
          if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
            uVar14 = *puStack_98;
            prStack_68._0_4_ = (uint)prStack_68 + 0x20;
            uVar21 = uVar21 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                      (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                              (-(char)(uint)prStack_68 & 0x3fU);
            puStack_98 = puStack_98 + 1;
          }
          else {
            for (; uVar32 = uVar31, (int)(uint)prStack_68 < 0x18;
                prStack_68._0_4_ = (uint)prStack_68 + 8) {
              if (*(char *)((long)p + 0x4b0) == '\0') {
                *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
                *(uint *)((long)p + 0x510) = uVar31;
                *(uint *)((long)p + 0x514) = (uint)uStack_80;
                *(ulong *)((long)p + 0x4c8) = uVar21;
                *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
                *(uint **)((long)p + 0x498) = puStack_98;
                *(uint *)((long)p + 0x4f70) = uVar28;
                *(int *)((long)p + 0x4f2c) = iVar40;
                *(int *)((long)p + 0x4f30) = uStack_60._4_4_;
                *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
                *(int *)((long)p + 0x4f38) = iStack_a0;
                *(uint *)((long)p + 0x4f3c) = uVar13;
                *(uint *)((long)p + 0x4f44) = uStack_70;
                *(uint *)((long)p + 0x4f48) = uStack_9c;
                *(int *)((long)p + 0x4f18) = (int)uVar49;
                goto LAB_001165e8;
              }
LAB_00116522:
              uVar35 = 0;
              if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
                uVar35 = (ulong)(byte)*puStack_98;
                puStack_98 = (uint *)((long)puStack_98 + 1);
              }
              uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
            }
          }
        }
        uVar14 = (uint)(ushort)(uVar21 >> 0x30);
        if (uVar14 < pdVar24->m_table_max_code) {
          uVar28 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
          uVar14 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
        }
        else {
          iVar27 = pdVar24->m_decode_start_code_size - 0x41;
          do {
            iVar17 = iVar27;
            iVar27 = iVar17 + 1;
          } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar14);
          uVar42 = (int)(uVar21 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                   pdVar24->m_val_ptrs[iVar17 + 0x40U];
          uVar14 = 0;
          if (uVar42 < prVar47->m_total_syms) {
            uVar14 = uVar42;
          }
          uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar14];
          uVar14 = iVar17 + 0x41;
        }
        uVar21 = uVar21 << ((byte)uVar14 & 0x3f);
        puVar2 = (prVar47->m_sym_freq).m_p + uVar28;
        *puVar2 = *puVar2 + 1;
        prStack_68._0_4_ = (uint)prStack_68 - uVar14;
        puVar1 = &prVar47->m_symbols_until_update;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          raw_quasi_adaptive_huffman_data_model::update(prVar47);
        }
        uVar28 = uVar28 + 2;
        uVar13 = (uint)(6 < uVar13) * 3 + 8;
      }
      else {
        *puVar18 = uVar4 - (uVar4 >> 5);
        uStack_80._0_4_ = uVar42 - (uint)uStack_80;
        uVar13 = (6 < uVar13) + 9 + (uint)(6 < uVar13);
      }
    }
LAB_001160f1:
    iVar27 = (int)uVar49;
    uVar35 = uVar49 & 0xffffffff;
    if ((uVar35 < (ulong)(long)iVar40) || (uVar49 = (ulong)(iVar27 + uVar28), uVar36 < uVar49)) {
      *(uint *)((long)p + 0x510) = uVar32;
      *(uint *)((long)p + 0x514) = (uint)uStack_80;
      *(ulong *)((long)p + 0x4c8) = uVar21;
      *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
      *(uint **)((long)p + 0x498) = puStack_98;
      **(long **)((long)p + 0x558) = (long)puStack_98 - *(long *)((long)p + 0x490);
      **(undefined8 **)((long)p + 0x568) = 0;
      goto LAB_00116190;
    }
    pbVar45 = pbVar7 + (uint)(iVar27 - iVar40);
    pbVar44 = pbVar7 + uVar35;
    if (iVar40 == 1) {
      bVar37 = *pbVar45;
      uStack_9c = (uint)bVar37;
      if (uVar28 < 8) {
        if ((uVar28 != 0) && (memset(pbVar44,(uint)bVar37,(ulong)uVar28), uVar28 == 1)) {
          uStack_9c = uStack_70;
        }
      }
      else {
        memset(pbVar44,uStack_9c,(ulong)uVar28);
      }
    }
    else if (uVar28 == 1) {
      bVar37 = *pbVar45;
      *pbVar44 = bVar37;
      uStack_9c = uStack_70;
    }
    else {
      uVar14 = uVar28 - 2;
      if ((uVar14 < 8) || (iVar40 < (int)uVar14)) {
        if (0 < (int)uVar14) {
          iVar27 = uVar28 - 1;
          do {
            bVar37 = *pbVar45;
            pbVar45 = pbVar45 + 1;
            *pbVar44 = bVar37;
            pbVar44 = pbVar44 + 1;
            iVar27 = iVar27 + -1;
          } while (1 < iVar27);
        }
      }
      else {
        uVar35 = (ulong)uVar14;
        memcpy(pbVar44,pbVar45,uVar35);
        pbVar44 = pbVar44 + uVar35;
        pbVar45 = pbVar45 + uVar35;
      }
      uStack_9c = (uint)*pbVar45;
      *pbVar44 = *pbVar45;
      bVar37 = pbVar45[1];
      pbVar44[1] = bVar37;
    }
    uVar14 = (uint)bVar37;
    goto LAB_001154b5;
  }
  *puVar18 = (short)(0x800 - uVar4 >> 5) + uVar4;
  prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x45a0);
  pdVar24 = *(decoder_tables **)((long)p + 0x45d0);
  uVar32 = uStack_8c;
  uStack_60._4_4_ = iVar40;
  if ((int)(uint)prStack_68 < 0x18) {
    if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
      uVar42 = *puStack_98;
      prStack_68._0_4_ = (uint)prStack_68 + 0x20;
      uVar21 = uVar21 | (ulong)(uVar42 >> 0x18 | (uVar42 & 0xff0000) >> 8 | (uVar42 & 0xff00) << 8 |
                               uVar42 << 0x18) << (-(char)(uint)prStack_68 & 0x3fU);
      puStack_98 = puStack_98 + 1;
    }
    else {
      for (; uVar32 = uStack_8c, uStack_60._4_4_ = iVar40, (int)(uint)prStack_68 < 0x18;
          prStack_68._0_4_ = (uint)prStack_68 + 8) {
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
          *(uint *)((long)p + 0x510) = uStack_8c;
          *(uint *)((long)p + 0x514) = (uint)uStack_80;
          *(ulong *)((long)p + 0x4c8) = uVar21;
          *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(uint *)((long)p + 0x4f70) = uVar28;
          *(int *)((long)p + 0x4f2c) = iVar40;
          *(int *)((long)p + 0x4f30) = iStack_6c;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uVar13;
          *(uint *)((long)p + 0x4f44) = uVar14;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
          goto LAB_0011688d;
        }
LAB_00116735:
        uVar35 = 0;
        if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
          uVar35 = (ulong)(byte)*puStack_98;
          puStack_98 = (uint *)((long)puStack_98 + 1);
        }
        uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
      }
    }
  }
  uStack_8c = uVar13;
  uVar13 = (uint)(ushort)(uVar21 >> 0x30);
  if (uVar13 < pdVar24->m_table_max_code) {
    uVar42 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
    uVar13 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
  }
  else {
    iVar40 = pdVar24->m_decode_start_code_size - 0x41;
    do {
      iVar27 = iVar40;
      iVar40 = iVar27 + 1;
    } while (pdVar24->m_max_codes[iVar27 + 0x40U] <= uVar13);
    uVar42 = (int)(uVar21 >> (-(char)(iVar27 + 1) & 0x3fU)) + pdVar24->m_val_ptrs[iVar27 + 0x40U];
    uVar13 = 0;
    if (uVar42 < prVar47->m_total_syms) {
      uVar13 = uVar42;
    }
    uVar42 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar13];
    uVar13 = iVar27 + 0x41;
  }
  uVar21 = uVar21 << ((byte)uVar13 & 0x3f);
  puVar2 = (prVar47->m_sym_freq).m_p + uVar42;
  *puVar2 = *puVar2 + 1;
  prStack_68._0_4_ = (uint)prStack_68 - uVar13;
  puVar1 = &prVar47->m_symbols_until_update;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 == 0) {
    raw_quasi_adaptive_huffman_data_model::update(prVar47);
  }
  if (1 < uVar42) {
    uVar28 = (uVar42 - 2 & 7) + 2;
    uVar13 = (uVar42 - 2 >> 3) + 1;
    uVar35 = (ulong)uVar13;
    uStack_70 = uVar14;
    if (uVar28 == 9) {
      prVar47 = (raw_quasi_adaptive_huffman_data_model *)
                ((long)p + (ulong)(6 < uStack_8c) * 0x80 + 0x4720);
      pdVar24 = *(decoder_tables **)((long)p + (ulong)(6 < uStack_8c) * 0x80 + 0x4750);
      iVar40 = 9;
      if ((int)(uint)prStack_68 < 0x18) {
        if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
          uVar14 = *puStack_98;
          prStack_68._0_4_ = (uint)prStack_68 + 0x20;
          uVar21 = uVar21 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                    (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                            (-(char)(uint)prStack_68 & 0x3fU);
          uVar35 = (ulong)uVar13;
          puStack_98 = puStack_98 + 1;
        }
        else {
          iVar40 = 9;
          for (; (int)(uint)prStack_68 < 0x18; prStack_68._0_4_ = (uint)prStack_68 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
              *(uint *)((long)p + 0x510) = uVar32;
              *(uint *)((long)p + 0x514) = (uint)uStack_80;
              *(ulong *)((long)p + 0x4c8) = uVar21;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(int *)((long)p + 0x4f70) = iVar40;
              *(uint *)((long)p + 0x4f74) = uVar13;
              *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
              *(int *)((long)p + 0x4f30) = iStack_6c;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uStack_8c;
              *(uint *)((long)p + 0x4f44) = uVar14;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_00116bbe;
            }
LAB_00116a6a:
            uVar35 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
              uVar35 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
            uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
          }
          uVar35 = (ulong)uVar13;
          uStack_70 = uVar14;
        }
      }
      uVar14 = (uint)(ushort)(uVar21 >> 0x30);
      if (uVar14 < pdVar24->m_table_max_code) {
        uVar28 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
        uVar14 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar27 = pdVar24->m_decode_start_code_size - 0x41;
        do {
          iVar17 = iVar27;
          iVar27 = iVar17 + 1;
        } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar14);
        uVar13 = (int)(uVar21 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                 pdVar24->m_val_ptrs[iVar17 + 0x40U];
        uVar14 = 0;
        if (uVar13 < prVar47->m_total_syms) {
          uVar14 = uVar13;
        }
        uVar28 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar14];
        uVar14 = iVar17 + 0x41;
      }
      uVar21 = uVar21 << ((byte)uVar14 & 0x3f);
      puVar2 = (prVar47->m_sym_freq).m_p + uVar28;
      *puVar2 = *puVar2 + 1;
      prStack_68._0_4_ = (uint)prStack_68 - uVar14;
      puVar1 = &prVar47->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar47);
      }
      uVar28 = uVar28 + iVar40;
    }
    uVar42 = (uint)uVar35;
    bVar37 = *(byte *)((long)p + uVar35 + 0x410);
    uVar14 = (uint)bVar37;
    uVar13 = (uint)prStack_68;
    if (uVar14 < 3) {
      for (; prStack_68._0_4_ = uVar13 - uVar14, (int)uVar13 < (int)uVar14; uVar13 = uVar13 + 8) {
        if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
          prStack_68._0_4_ = (uint)uVar35;
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar32;
            *(uint *)((long)p + 0x514) = (uint)uStack_80;
            *(ulong *)((long)p + 0x4c8) = uVar21;
            *(uint *)((long)p + 0x4d0) = uVar13;
            *(uint **)((long)p + 0x498) = puStack_98;
            *(uint *)((long)p + 0x4f70) = uVar28;
            *(uint *)((long)p + 0x4f74) = (uint)prStack_68;
            *(uint *)((long)p + 0x4f7c) = uVar14;
            *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_6c;
            *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
            *(int *)((long)p + 0x4f38) = iStack_a0;
            *(uint *)((long)p + 0x4f3c) = uStack_8c;
            *(uint *)((long)p + 0x4f44) = uStack_70;
            *(uint *)((long)p + 0x4f48) = uStack_9c;
            *(int *)((long)p + 0x4f18) = (int)uVar49;
            goto LAB_00111c25;
          }
LAB_001135cc:
          uVar23 = 0;
          uVar35 = (ulong)(uint)prStack_68;
          if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00114bcb;
        }
        else {
LAB_00114bcb:
          uVar23 = (ulong)(byte)*puStack_98;
          puStack_98 = (uint *)((long)puStack_98 + 1);
        }
        uVar21 = uVar21 | uVar23 << (0x38U - (char)uVar13 & 0x3f);
      }
      iVar40 = (int)(uVar21 >> (-(byte)uVar14 & 0x3f));
      if (uVar14 == 0) {
        iVar40 = 0;
      }
      uVar21 = uVar21 << ((byte)uVar14 & 0x3f);
      iStack_a0 = uStack_80._4_4_;
      uStack_80._4_4_ = iStack_6c;
    }
    else {
      iVar40 = 0;
      if (4 < bVar37) {
        while( true ) {
          iVar27 = uVar14 - 4;
          if (iVar27 <= (int)(uint)prStack_68) break;
          if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(uint *)((long)p + 0x510) = uVar32;
              *(uint *)((long)p + 0x514) = (uint)uStack_80;
              *(ulong *)((long)p + 0x4c8) = uVar21;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(uint *)((long)p + 0x4f70) = uVar28;
              *(uint *)((long)p + 0x4f74) = uVar42;
              *(uint *)((long)p + 0x4f7c) = uVar14;
              *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
              *(int *)((long)p + 0x4f30) = iStack_6c;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uStack_8c;
              *(uint *)((long)p + 0x4f44) = uStack_70;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_001122f5;
            }
LAB_00113105:
            uVar35 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00116e02;
          }
          else {
LAB_00116e02:
            uVar35 = (ulong)(byte)*puStack_98;
            puStack_98 = (uint *)((long)puStack_98 + 1);
          }
          cVar11 = (char)(uint)prStack_68;
          prStack_68._0_4_ = (uint)prStack_68 + 8;
          uVar21 = uVar21 | uVar35 << (0x38U - cVar11 & 0x3f);
        }
        iVar40 = (int)(uVar21 >> (0x44U - (char)uVar14 & 0x3f)) << 4;
        if (iVar27 == 0) {
          iVar40 = 0;
        }
        uVar21 = uVar21 << ((byte)iVar27 & 0x3f);
        prStack_68._0_4_ = (uint)prStack_68 - iVar27;
      }
      prVar47 = (raw_quasi_adaptive_huffman_data_model *)((long)p + 0x4820);
      pdVar24 = *(decoder_tables **)((long)p + 0x4850);
      if ((int)(uint)prStack_68 < 0x18) {
        if (puStack_98 + 1 < *(uint **)((long)p + 0x4a0)) {
          uVar14 = *puStack_98;
          prStack_68._0_4_ = (uint)prStack_68 + 0x20;
          uVar21 = uVar21 | (ulong)(uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 |
                                    (uVar14 & 0xff00) << 8 | uVar14 << 0x18) <<
                            (-(char)(uint)prStack_68 & 0x3fU);
          puStack_98 = puStack_98 + 1;
        }
        else {
          for (; (int)(uint)prStack_68 < 0x18; prStack_68._0_4_ = (uint)prStack_68 + 8) {
            if (*(char *)((long)p + 0x4b0) == '\0') {
              *(raw_quasi_adaptive_huffman_data_model **)((long)p + 0x520) = prVar47;
              *(uint *)((long)p + 0x510) = uVar32;
              *(uint *)((long)p + 0x514) = (uint)uStack_80;
              *(ulong *)((long)p + 0x4c8) = uVar21;
              *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
              *(uint **)((long)p + 0x498) = puStack_98;
              *(uint *)((long)p + 0x4f70) = uVar28;
              *(uint *)((long)p + 0x4f74) = uVar42;
              *(int *)((long)p + 0x4f78) = iVar40;
              *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
              *(int *)((long)p + 0x4f30) = iStack_6c;
              *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
              *(int *)((long)p + 0x4f38) = iStack_a0;
              *(uint *)((long)p + 0x4f3c) = uStack_8c;
              *(uint *)((long)p + 0x4f44) = uStack_70;
              *(uint *)((long)p + 0x4f48) = uStack_9c;
              *(int *)((long)p + 0x4f18) = (int)uVar49;
              goto LAB_001142d5;
            }
LAB_00114208:
            uVar35 = 0;
            if (puStack_98 < *(uint **)((long)p + 0x4a0)) {
              uVar35 = (ulong)(byte)*puStack_98;
              puStack_98 = (uint *)((long)puStack_98 + 1);
            }
            uVar21 = uVar21 | uVar35 << (0x38U - (char)(uint)prStack_68 & 0x3f);
          }
        }
      }
      uVar14 = (uint)(ushort)(uVar21 >> 0x30);
      if (uVar14 < pdVar24->m_table_max_code) {
        uVar13 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] & 0xffff;
        uVar14 = pdVar24->m_lookup[uVar21 >> (-(char)pdVar24->m_table_bits & 0x3fU)] >> 0x10;
      }
      else {
        iVar27 = pdVar24->m_decode_start_code_size - 0x41;
        do {
          iVar17 = iVar27;
          iVar27 = iVar17 + 1;
        } while (pdVar24->m_max_codes[iVar17 + 0x40U] <= uVar14);
        uVar13 = (int)(uVar21 >> (-(char)(iVar17 + 1) & 0x3fU)) +
                 pdVar24->m_val_ptrs[iVar17 + 0x40U];
        uVar14 = 0;
        if (uVar13 < prVar47->m_total_syms) {
          uVar14 = uVar13;
        }
        uVar13 = (uint)pdVar24->m_sorted_symbol_order[(int)uVar14];
        uVar14 = iVar17 + 0x41;
      }
      uVar21 = uVar21 << ((byte)uVar14 & 0x3f);
      puVar2 = (prVar47->m_sym_freq).m_p + uVar13;
      *puVar2 = *puVar2 + 1;
      prStack_68._0_4_ = (uint)prStack_68 - uVar14;
      puVar1 = &prVar47->m_symbols_until_update;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        raw_quasi_adaptive_huffman_data_model::update(prVar47);
      }
      iVar40 = uVar13 + iVar40;
      uVar35 = (ulong)uVar42;
      iStack_a0 = uStack_80._4_4_;
      uStack_80._4_4_ = iStack_6c;
    }
    iVar40 = iVar40 + *(int *)((long)p + uVar35 * 4 + 0x10);
    uVar13 = (uint)(6 < uStack_8c) * 3 + 7;
    goto LAB_001160f1;
  }
  uVar13 = 0;
  if (uVar42 != 0) {
    iStack_a0 = 1;
    uStack_80._4_4_ = 1;
    uStack_60._4_4_ = 1;
    iVar40 = 1;
    goto LAB_001154b5;
  }
  if (((uint)prStack_68 & 7) != 0) goto LAB_00116f3c;
LAB_00116f51:
  *(int *)((long)p + 0x4f28) = *(int *)((long)p + 0x4f28) + 1;
  uStack_70 = uVar14;
  if (*(int *)((long)p + 0x598) == 0) {
LAB_00114773:
    do {
      if (1 < (int)(uint)prStack_68) {
        *(uint *)((long)p + 0x4f4c) = (uint)(uVar21 >> 0x3e);
        lVar12 = (*(code *)(&DAT_00122d10 + *(int *)(&DAT_00122d10 + (uVar21 >> 0x3e) * 4)))
                           (uStack_80._4_4_,uVar21 << 2,&DAT_00122d10,
                            &DAT_00122d10 + *(int *)(&DAT_00122d10 + (uVar21 >> 0x3e) * 4));
        return lVar12;
      }
      if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar32;
          *(uint *)((long)p + 0x514) = (uint)uStack_80;
          *(ulong *)((long)p + 0x4c8) = uVar21;
          *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_6c;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(uint *)((long)p + 0x4f44) = uStack_70;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
          goto LAB_001124b9;
        }
LAB_001133f6:
        uVar36 = 0;
        if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_0011480b;
      }
      else {
LAB_0011480b:
        uVar36 = (ulong)(byte)*puStack_98;
        puStack_98 = (uint *)((long)puStack_98 + 1);
      }
      cVar11 = (char)(uint)prStack_68;
      prStack_68._0_4_ = (uint)prStack_68 + 8;
      uVar21 = uVar21 | uVar36 << (0x38U - cVar11 & 0x3f);
    } while( true );
  }
LAB_00116f6b:
  if (*(int *)((long)p + 0x598) == 2) {
    if (((uint)prStack_68 & 7) != 0) {
      for (; (int)(uint)prStack_68 < 0; prStack_68._0_4_ = (uint)prStack_68 + 8) {
        if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
          if (*(char *)((long)p + 0x4b0) == '\0') {
            *(uint *)((long)p + 0x510) = uVar32;
            *(uint *)((long)p + 0x514) = (uint)uStack_80;
            *(ulong *)((long)p + 0x4c8) = uVar21;
            *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
            *(uint **)((long)p + 0x498) = puStack_98;
            *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
            *(int *)((long)p + 0x4f30) = iStack_6c;
            *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
            *(int *)((long)p + 0x4f38) = iStack_a0;
            *(uint *)((long)p + 0x4f3c) = uStack_8c;
            *(uint *)((long)p + 0x4f44) = uVar14;
            *(uint *)((long)p + 0x4f48) = uStack_9c;
            *(int *)((long)p + 0x4f18) = (int)uVar49;
            goto LAB_00112eb5;
          }
LAB_00113cc9:
          if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00117090;
          uVar36 = 0;
        }
        else {
LAB_00117090:
          uVar36 = (ulong)(byte)*puStack_98;
          puStack_98 = (uint *)((long)puStack_98 + 1);
        }
        uVar21 = uVar21 | uVar36 << (0x38U - (char)(uint)prStack_68 & 0x3f);
      }
      uVar21 = uVar21 << ((byte)(uint)prStack_68 & 7);
      prStack_68._0_4_ = (uint)prStack_68 & 0x7ffffff8;
    }
    for (; (int)(uint)prStack_68 < 0x10; prStack_68._0_4_ = (uint)prStack_68 + 8) {
      if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar32;
          *(uint *)((long)p + 0x514) = (uint)uStack_80;
          *(ulong *)((long)p + 0x4c8) = uVar21;
          *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_6c;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(uint *)((long)p + 0x4f44) = uVar14;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
          goto LAB_00112f36;
        }
LAB_00113e05:
        if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00117194;
        uVar36 = 0;
      }
      else {
LAB_00117194:
        uVar36 = (ulong)(byte)*puStack_98;
        puStack_98 = (uint *)((long)puStack_98 + 1);
      }
      uVar21 = uVar21 | uVar36 << (0x38U - (char)(uint)prStack_68 & 0x3f);
    }
    *(uint *)((long)p + 0x4f68) = (uint)(ushort)(uVar21 >> 0x30);
    uVar36 = uVar21 << 0x10;
    for (iVar40 = (uint)prStack_68 - 0x10; iVar40 < 0x10; iVar40 = iVar40 + 8) {
      if (puStack_98 == *(uint **)((long)p + 0x4a0)) {
        if (*(char *)((long)p + 0x4b0) == '\0') {
          *(uint *)((long)p + 0x510) = uVar32;
          *(uint *)((long)p + 0x514) = (uint)uStack_80;
          *(ulong *)((long)p + 0x4c8) = uVar36;
          *(int *)((long)p + 0x4d0) = iVar40;
          *(uint **)((long)p + 0x498) = puStack_98;
          *(int *)((long)p + 0x4f2c) = uStack_60._4_4_;
          *(int *)((long)p + 0x4f30) = iStack_6c;
          *(int *)((long)p + 0x4f34) = uStack_80._4_4_;
          *(int *)((long)p + 0x4f38) = iStack_a0;
          *(uint *)((long)p + 0x4f3c) = uStack_8c;
          *(uint *)((long)p + 0x4f44) = uVar14;
          *(uint *)((long)p + 0x4f48) = uStack_9c;
          *(int *)((long)p + 0x4f18) = (int)uVar49;
          goto LAB_00112e34;
        }
LAB_00113c2c:
        if (puStack_98 < *(uint **)((long)p + 0x4a0)) goto LAB_00117378;
        uVar21 = 0;
      }
      else {
LAB_00117378:
        uVar21 = (ulong)(byte)*puStack_98;
        puStack_98 = (uint *)((long)puStack_98 + 1);
      }
      uVar36 = uVar36 | uVar21 << (0x38U - (char)iVar40 & 0x3f);
    }
    uVar21 = uVar36 << 0x10;
    prStack_68._0_4_ = iVar40 - 0x10;
    uVar14 = *(int *)((long)p + 0x4f68) << 0x10 | (uint)(ushort)(uVar36 >> 0x30);
    *(uint *)((long)p + 0x4f68) = uVar14;
    if (*(int *)((long)p + 0x594) == 0) {
      lVar25 = 0x548;
    }
    else {
      uVar15 = adler32(pbVar7,uVar49 & 0xffffffff,1);
      *(uint *)((long)p + 0x548) = uVar15;
      if (*(uint *)((long)p + 0x4f68) == uVar15) goto LAB_001172ee;
      uVar14 = 7;
      lVar25 = 0x598;
    }
    *(uint *)((long)p + lVar25) = uVar14;
  }
LAB_001172ee:
  *(uint *)((long)p + 0x510) = uVar32;
  *(uint *)((long)p + 0x514) = (uint)uStack_80;
  *(ulong *)((long)p + 0x4c8) = uVar21;
  *(uint *)((long)p + 0x4d0) = (uint)prStack_68;
  *(uint **)((long)p + 0x498) = puStack_98;
  uVar19 = symbol_codec::stop_decoding((symbol_codec *)((long)p + 0x490));
  **(uint64 **)((long)p + 0x558) = uVar19;
  **(ulong **)((long)p + 0x568) = uVar49 & 0xffffffff;
LAB_0011733c:
  *(undefined4 *)p = 0x35c;
switchD_00111d89_caseD_338:
  return *(lzham_decompress_status_t *)((long)p + 0x598);
}

Assistant:

lzham_decompress_status_t lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_output_unbuffered)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;
      if (pState->m_params.m_output_unbuffered)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();

      //void *q = alloca(4096);
      //memset(q, 0xFE, 4096);

      return status;
   }